

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  BBox1f BVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  int iVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  uint uVar58;
  uint uVar59;
  ulong uVar60;
  byte bVar61;
  uint uVar62;
  long lVar63;
  ulong uVar64;
  long lVar65;
  uint uVar66;
  float fVar67;
  undefined4 uVar68;
  vint4 bi_2;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar100;
  undefined8 uVar101;
  vint4 bi_1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 extraout_var [56];
  float fVar128;
  vint4 bi;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar143;
  float fVar146;
  float fVar164;
  float fVar165;
  vint4 ai;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar166;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar144;
  undefined1 auVar154 [16];
  float fVar145;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  vint4 ai_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  vint4 ai_2;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  float fVar219;
  float fVar220;
  float fVar236;
  float fVar238;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar237;
  float fVar239;
  undefined1 auVar235 [32];
  float fVar243;
  float fVar258;
  float fVar259;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar260;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar252 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  __m128 a;
  undefined1 auVar298 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [32];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar323 [16];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  float fVar329;
  float fVar337;
  float fVar338;
  undefined1 auVar330 [16];
  float fVar339;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar336 [32];
  uint local_658;
  undefined1 local_638 [8];
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  undefined1 local_558 [8];
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_540;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_508 [32];
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [16];
  undefined1 (*local_468) [16];
  Primitive *local_460;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 auStack_448 [16];
  RTCFilterFunctionNArguments args;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined4 local_3d8;
  undefined4 local_3c8;
  uint mask_stack [4];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar127 [64];
  float fVar198;
  float fVar218;
  undefined1 auVar335 [32];
  
  PVar7 = prim[1];
  uVar60 = (ulong)(byte)PVar7;
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  lVar63 = uVar60 * 0x25;
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar187 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xf + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x11 + 6)));
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1a + 6)));
  fVar67 = *(float *)(prim + lVar63 + 0x12);
  auVar122 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar122 = vinsertps_avx(auVar122,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar272._0_4_ = fVar67 * auVar122._0_4_;
  auVar272._4_4_ = fVar67 * auVar122._4_4_;
  auVar272._8_4_ = fVar67 * auVar122._8_4_;
  auVar272._12_4_ = fVar67 * auVar122._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar20);
  auVar20 = vcvtdq2ps_avx(auVar21);
  auVar21 = vcvtdq2ps_avx(auVar22);
  auVar22 = vcvtdq2ps_avx(auVar187);
  auVar187 = vcvtdq2ps_avx(auVar23);
  auVar23 = vcvtdq2ps_avx(auVar24);
  auVar24 = vcvtdq2ps_avx(auVar109);
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1b + 6)));
  auVar109 = vcvtdq2ps_avx(auVar122);
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1c + 6)));
  auVar17 = vcvtdq2ps_avx(auVar122);
  auVar69._4_4_ = auVar272._0_4_;
  auVar69._0_4_ = auVar272._0_4_;
  auVar69._8_4_ = auVar272._0_4_;
  auVar69._12_4_ = auVar272._0_4_;
  auVar122 = vshufps_avx(auVar272,auVar272,0x55);
  auVar133 = vshufps_avx(auVar272,auVar272,0xaa);
  fVar128 = auVar133._0_4_;
  auVar244._0_4_ = fVar128 * auVar21._0_4_;
  fVar100 = auVar133._4_4_;
  auVar244._4_4_ = fVar100 * auVar21._4_4_;
  fVar145 = auVar133._8_4_;
  auVar244._8_4_ = fVar145 * auVar21._8_4_;
  fVar146 = auVar133._12_4_;
  auVar244._12_4_ = fVar146 * auVar21._12_4_;
  auVar273._0_4_ = auVar23._0_4_ * fVar128;
  auVar273._4_4_ = auVar23._4_4_ * fVar100;
  auVar273._8_4_ = auVar23._8_4_ * fVar145;
  auVar273._12_4_ = auVar23._12_4_ * fVar146;
  auVar306._0_4_ = auVar17._0_4_ * fVar128;
  auVar306._4_4_ = auVar17._4_4_ * fVar100;
  auVar306._8_4_ = auVar17._8_4_ * fVar145;
  auVar306._12_4_ = auVar17._12_4_ * fVar146;
  auVar133 = vfmadd231ps_fma(auVar244,auVar122,auVar20);
  auVar150 = vfmadd231ps_fma(auVar273,auVar122,auVar187);
  auVar122 = vfmadd231ps_fma(auVar306,auVar109,auVar122);
  auVar133 = vfmadd231ps_fma(auVar133,auVar69,auVar16);
  auVar150 = vfmadd231ps_fma(auVar150,auVar69,auVar22);
  auVar72 = vfmadd231ps_fma(auVar122,auVar24,auVar69);
  auVar70._8_4_ = 0x7fffffff;
  auVar70._0_8_ = 0x7fffffff7fffffff;
  auVar70._12_4_ = 0x7fffffff;
  auVar122 = vandps_avx(auVar133,auVar70);
  auVar129._8_4_ = 0x219392ef;
  auVar129._0_8_ = 0x219392ef219392ef;
  auVar129._12_4_ = 0x219392ef;
  auVar122 = vcmpps_avx(auVar122,auVar129,1);
  auVar69 = vblendvps_avx(auVar133,auVar129,auVar122);
  auVar122 = vandps_avx(auVar150,auVar70);
  auVar122 = vcmpps_avx(auVar122,auVar129,1);
  auVar71 = vblendvps_avx(auVar150,auVar129,auVar122);
  auVar122 = vandps_avx(auVar72,auVar70);
  auVar122 = vcmpps_avx(auVar122,auVar129,1);
  auVar72 = vblendvps_avx(auVar72,auVar129,auVar122);
  auVar122 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar122 = vinsertps_avx(auVar122,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar122 = vsubps_avx(auVar122,*(undefined1 (*) [16])(prim + lVar63 + 6));
  fVar128 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar63 + 0x16)) *
            *(float *)(prim + lVar63 + 0x1a);
  auVar307._0_4_ = auVar122._0_4_ * fVar67;
  auVar307._4_4_ = auVar122._4_4_ * fVar67;
  auVar307._8_4_ = auVar122._8_4_ * fVar67;
  auVar307._12_4_ = auVar122._12_4_ * fVar67;
  auVar122 = vshufps_avx(auVar307,auVar307,0xaa);
  fVar67 = auVar122._0_4_;
  auVar245._0_4_ = fVar67 * auVar21._0_4_;
  fVar100 = auVar122._4_4_;
  auVar245._4_4_ = fVar100 * auVar21._4_4_;
  fVar145 = auVar122._8_4_;
  auVar245._8_4_ = fVar145 * auVar21._8_4_;
  fVar146 = auVar122._12_4_;
  auVar245._12_4_ = fVar146 * auVar21._12_4_;
  auVar221._0_4_ = auVar23._0_4_ * fVar67;
  auVar221._4_4_ = auVar23._4_4_ * fVar100;
  auVar221._8_4_ = auVar23._8_4_ * fVar145;
  auVar221._12_4_ = auVar23._12_4_ * fVar146;
  auVar199._0_4_ = auVar17._0_4_ * fVar67;
  auVar199._4_4_ = auVar17._4_4_ * fVar100;
  auVar199._8_4_ = auVar17._8_4_ * fVar145;
  auVar199._12_4_ = auVar17._12_4_ * fVar146;
  auVar21 = vshufps_avx(auVar307,auVar307,0x55);
  auVar23 = vfmadd231ps_fma(auVar245,auVar21,auVar20);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar122 = vpmovsxwd_avx(auVar122);
  auVar187 = vfmadd231ps_fma(auVar221,auVar21,auVar187);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar20 = vpmovsxwd_avx(auVar20);
  auVar109 = vfmadd231ps_fma(auVar199,auVar21,auVar109);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar21 = vpmovsxwd_avx(auVar21);
  auVar308._4_4_ = auVar307._0_4_;
  auVar308._0_4_ = auVar307._0_4_;
  auVar308._8_4_ = auVar307._0_4_;
  auVar308._12_4_ = auVar307._0_4_;
  auVar129 = vfmadd231ps_fma(auVar23,auVar308,auVar16);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar132 = vfmadd231ps_fma(auVar187,auVar308,auVar22);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar22 = vpmovsxwd_avx(auVar22);
  auVar199 = vfmadd231ps_fma(auVar109,auVar308,auVar24);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar60 * 0x16 + 6);
  auVar187 = vpmovsxwd_avx(auVar187);
  auVar274._4_4_ = fVar128;
  auVar274._0_4_ = fVar128;
  auVar274._8_4_ = fVar128;
  auVar274._12_4_ = fVar128;
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar122);
  auVar102 = vfmadd213ps_fma(auVar20,auVar274,auVar122);
  auVar122 = vcvtdq2ps_avx(auVar21);
  auVar20 = vcvtdq2ps_avx(auVar16);
  auVar20 = vsubps_avx(auVar20,auVar122);
  auVar103 = vfmadd213ps_fma(auVar20,auVar274,auVar122);
  auVar122 = vcvtdq2ps_avx(auVar22);
  auVar20 = vcvtdq2ps_avx(auVar187);
  auVar20 = vsubps_avx(auVar20,auVar122);
  auVar22 = vfmadd213ps_fma(auVar20,auVar274,auVar122);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar60 * 0x14 + 6);
  auVar122 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar60 * 0x18 + 6);
  auVar20 = vpmovsxwd_avx(auVar24);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar122);
  auVar187 = vfmadd213ps_fma(auVar20,auVar274,auVar122);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar60 * 0x1d + 6);
  auVar122 = vpmovsxwd_avx(auVar109);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar60 * 0x21 + 6);
  auVar20 = vpmovsxwd_avx(auVar17);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar122);
  auVar23 = vfmadd213ps_fma(auVar20,auVar274,auVar122);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar60 * 0x1f + 6);
  auVar122 = vpmovsxwd_avx(auVar133);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar60 * 0x23 + 6);
  auVar20 = vpmovsxwd_avx(auVar150);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar122);
  auVar24 = vfmadd213ps_fma(auVar20,auVar274,auVar122);
  auVar122 = vrcpps_avx(auVar69);
  auVar130._8_4_ = 0x3f800000;
  auVar130._0_8_ = 0x3f8000003f800000;
  auVar130._12_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar69,auVar122,auVar130);
  auVar20 = vfmadd132ps_fma(auVar20,auVar122,auVar122);
  auVar122 = vrcpps_avx(auVar71);
  auVar21 = vfnmadd213ps_fma(auVar71,auVar122,auVar130);
  auVar21 = vfmadd132ps_fma(auVar21,auVar122,auVar122);
  auVar122 = vrcpps_avx(auVar72);
  auVar16 = vfnmadd213ps_fma(auVar72,auVar122,auVar130);
  auVar16 = vfmadd132ps_fma(auVar16,auVar122,auVar122);
  auVar122 = vsubps_avx(auVar102,auVar129);
  auVar147._0_4_ = auVar20._0_4_ * auVar122._0_4_;
  auVar147._4_4_ = auVar20._4_4_ * auVar122._4_4_;
  auVar147._8_4_ = auVar20._8_4_ * auVar122._8_4_;
  auVar147._12_4_ = auVar20._12_4_ * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar103,auVar129);
  auVar131._0_4_ = auVar20._0_4_ * auVar122._0_4_;
  auVar131._4_4_ = auVar20._4_4_ * auVar122._4_4_;
  auVar131._8_4_ = auVar20._8_4_ * auVar122._8_4_;
  auVar131._12_4_ = auVar20._12_4_ * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar22,auVar132);
  auVar167._0_4_ = auVar21._0_4_ * auVar122._0_4_;
  auVar167._4_4_ = auVar21._4_4_ * auVar122._4_4_;
  auVar167._8_4_ = auVar21._8_4_ * auVar122._8_4_;
  auVar167._12_4_ = auVar21._12_4_ * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar187,auVar132);
  auVar102._0_4_ = auVar21._0_4_ * auVar122._0_4_;
  auVar102._4_4_ = auVar21._4_4_ * auVar122._4_4_;
  auVar102._8_4_ = auVar21._8_4_ * auVar122._8_4_;
  auVar102._12_4_ = auVar21._12_4_ * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar23,auVar199);
  auVar181._0_4_ = auVar16._0_4_ * auVar122._0_4_;
  auVar181._4_4_ = auVar16._4_4_ * auVar122._4_4_;
  auVar181._8_4_ = auVar16._8_4_ * auVar122._8_4_;
  auVar181._12_4_ = auVar16._12_4_ * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar24,auVar199);
  auVar71._0_4_ = auVar16._0_4_ * auVar122._0_4_;
  auVar71._4_4_ = auVar16._4_4_ * auVar122._4_4_;
  auVar71._8_4_ = auVar16._8_4_ * auVar122._8_4_;
  auVar71._12_4_ = auVar16._12_4_ * auVar122._12_4_;
  auVar122 = vpminsd_avx(auVar147,auVar131);
  auVar20 = vpminsd_avx(auVar167,auVar102);
  auVar122 = vmaxps_avx(auVar122,auVar20);
  auVar20 = vpminsd_avx(auVar181,auVar71);
  uVar68 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar246._4_4_ = uVar68;
  auVar246._0_4_ = uVar68;
  auVar246._8_4_ = uVar68;
  auVar246._12_4_ = uVar68;
  auVar20 = vmaxps_avx(auVar20,auVar246);
  auVar122 = vmaxps_avx(auVar122,auVar20);
  auVar200._0_4_ = auVar122._0_4_ * 0.99999964;
  auVar200._4_4_ = auVar122._4_4_ * 0.99999964;
  auVar200._8_4_ = auVar122._8_4_ * 0.99999964;
  auVar200._12_4_ = auVar122._12_4_ * 0.99999964;
  auVar122 = vpmaxsd_avx(auVar147,auVar131);
  auVar20 = vpmaxsd_avx(auVar167,auVar102);
  auVar122 = vminps_avx(auVar122,auVar20);
  auVar20 = vpmaxsd_avx(auVar181,auVar71);
  uVar68 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar132._4_4_ = uVar68;
  auVar132._0_4_ = uVar68;
  auVar132._8_4_ = uVar68;
  auVar132._12_4_ = uVar68;
  auVar20 = vminps_avx(auVar20,auVar132);
  auVar122 = vminps_avx(auVar122,auVar20);
  auVar72._0_4_ = auVar122._0_4_ * 1.0000004;
  auVar72._4_4_ = auVar122._4_4_ * 1.0000004;
  auVar72._8_4_ = auVar122._8_4_ * 1.0000004;
  auVar72._12_4_ = auVar122._12_4_ * 1.0000004;
  local_658 = CONCAT31(0,PVar7);
  auVar103[4] = PVar7;
  auVar103._0_4_ = local_658;
  auVar103._5_3_ = 0;
  auVar103[8] = PVar7;
  auVar103._9_3_ = 0;
  auVar103[0xc] = PVar7;
  auVar103._13_3_ = 0;
  auVar20 = vpcmpgtd_avx(auVar103,_DAT_01f4ad30);
  auVar122 = vcmpps_avx(auVar200,auVar72,2);
  auVar122 = vandps_avx(auVar122,auVar20);
  uVar66 = vmovmskps_avx(auVar122);
  auVar96._16_16_ = mm_lookupmask_ps._240_16_;
  auVar96._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar96,ZEXT832(0) << 0x20,0x80);
  local_468 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_460 = prim;
LAB_012933de:
  uVar60 = (ulong)uVar66;
  if (uVar60 == 0) {
    return;
  }
  lVar63 = 0;
  for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar63 = lVar63 + 1;
  }
  uVar59 = *(uint *)(local_460 + 2);
  uVar8 = *(uint *)(local_460 + lVar63 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar59].ptr;
  fVar67 = (pGVar9->time_range).lower;
  fVar100 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar67) / ((pGVar9->time_range).upper - fVar67));
  auVar122 = vroundss_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100),9);
  auVar122 = vminss_avx(auVar122,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar17 = vmaxss_avx(ZEXT816(0),auVar122);
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar8 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar65 = (long)(int)auVar17._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar65);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar65);
  auVar122 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar60);
  lVar63 = uVar60 + 1;
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar63);
  lVar1 = uVar60 + 2;
  auVar21 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar60 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
  auVar56 = *pauVar3;
  fVar67 = *(float *)pauVar3[1];
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar65);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar65);
  auVar16 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar60);
  auVar22 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar63);
  auVar187 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar128 = *pfVar4;
  fVar145 = pfVar4[1];
  fVar146 = pfVar4[2];
  fVar144 = pfVar4[3];
  auVar309._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar309._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar309._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar309._12_4_ = fVar67 * 0.0;
  auVar295._8_4_ = 0x3f000000;
  auVar295._0_8_ = 0x3f0000003f000000;
  auVar295._12_4_ = 0x3f000000;
  auVar23 = vfmadd231ps_fma(auVar309,auVar21,auVar295);
  auVar23 = vfmadd231ps_fma(auVar23,auVar20,ZEXT816(0) << 0x40);
  auVar131 = vfnmadd231ps_fma(auVar23,auVar122,auVar295);
  auVar201._8_4_ = 0x80000000;
  auVar201._0_8_ = 0x8000000080000000;
  auVar201._12_4_ = 0x80000000;
  auVar247._0_4_ = fVar128 * -0.0;
  auVar247._4_4_ = fVar145 * -0.0;
  auVar247._8_4_ = fVar146 * -0.0;
  auVar247._12_4_ = fVar144 * -0.0;
  auVar23 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar187,auVar247);
  auVar222._0_4_ = auVar22._0_4_ + auVar23._0_4_;
  auVar222._4_4_ = auVar22._4_4_ + auVar23._4_4_;
  auVar222._8_4_ = auVar22._8_4_ + auVar23._8_4_;
  auVar222._12_4_ = auVar22._12_4_ + auVar23._12_4_;
  auVar23 = vfmadd231ps_fma(auVar222,auVar16,auVar201);
  auVar133 = ZEXT816(0) << 0x20;
  auVar202._0_4_ = fVar128 * 0.0;
  auVar202._4_4_ = fVar145 * 0.0;
  auVar202._8_4_ = fVar146 * 0.0;
  auVar202._12_4_ = fVar144 * 0.0;
  auVar24 = vfmadd231ps_fma(auVar202,auVar187,auVar295);
  auVar24 = vfmadd231ps_fma(auVar24,auVar22,auVar133);
  auVar109 = vfnmadd231ps_fma(auVar24,auVar16,auVar295);
  auVar289._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar289._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar289._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar289._12_4_ = fVar67 * 0.5;
  auVar24 = vfmadd231ps_fma(auVar289,auVar133,auVar21);
  auVar24 = vfnmadd231ps_fma(auVar24,auVar295,auVar20);
  auVar69 = vfmadd231ps_fma(auVar24,auVar133,auVar122);
  auVar248._0_4_ = auVar247._0_4_ + auVar187._0_4_;
  auVar248._4_4_ = auVar247._4_4_ + auVar187._4_4_;
  auVar248._8_4_ = auVar247._8_4_ + auVar187._8_4_;
  auVar248._12_4_ = auVar247._12_4_ + auVar187._12_4_;
  auVar24 = vfmadd231ps_fma(auVar248,auVar22,auVar133);
  auVar148._8_4_ = 0x80000000;
  auVar148._0_8_ = 0x8000000080000000;
  auVar148._12_4_ = 0x80000000;
  auVar24 = vfmadd231ps_fma(auVar24,auVar16,auVar148);
  auVar182._0_4_ = fVar128 * 0.5;
  auVar182._4_4_ = fVar145 * 0.5;
  auVar182._8_4_ = fVar146 * 0.5;
  auVar182._12_4_ = fVar144 * 0.5;
  auVar187 = vfmadd231ps_fma(auVar182,auVar133,auVar187);
  auVar22 = vfnmadd231ps_fma(auVar187,auVar295,auVar22);
  auVar187 = vfmadd231ps_fma(auVar22,auVar133,auVar16);
  auVar16 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar22 = vshufps_avx(auVar23,auVar23,0xc9);
  fVar240 = auVar131._0_4_;
  auVar104._0_4_ = fVar240 * auVar22._0_4_;
  fVar241 = auVar131._4_4_;
  auVar104._4_4_ = fVar241 * auVar22._4_4_;
  fVar242 = auVar131._8_4_;
  auVar104._8_4_ = fVar242 * auVar22._8_4_;
  fVar99 = auVar131._12_4_;
  auVar104._12_4_ = fVar99 * auVar22._12_4_;
  auVar71 = vfmsub231ps_fma(auVar104,auVar16,auVar23);
  auVar22 = vshufps_avx(auVar109,auVar109,0xc9);
  auVar105._0_4_ = fVar240 * auVar22._0_4_;
  auVar105._4_4_ = fVar241 * auVar22._4_4_;
  auVar105._8_4_ = fVar242 * auVar22._8_4_;
  auVar105._12_4_ = fVar99 * auVar22._12_4_;
  auVar72 = vfmsub231ps_fma(auVar105,auVar16,auVar109);
  auVar16 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar22 = vshufps_avx(auVar24,auVar24,0xc9);
  fVar236 = auVar69._0_4_;
  auVar106._0_4_ = fVar236 * auVar22._0_4_;
  fVar237 = auVar69._4_4_;
  auVar106._4_4_ = fVar237 * auVar22._4_4_;
  fVar238 = auVar69._8_4_;
  auVar106._8_4_ = fVar238 * auVar22._8_4_;
  fVar239 = auVar69._12_4_;
  auVar106._12_4_ = fVar239 * auVar22._12_4_;
  auVar102 = vfmsub231ps_fma(auVar106,auVar16,auVar24);
  auVar22 = vshufps_avx(auVar187,auVar187,0xc9);
  auVar107._0_4_ = fVar236 * auVar22._0_4_;
  auVar107._4_4_ = fVar237 * auVar22._4_4_;
  auVar107._8_4_ = fVar238 * auVar22._8_4_;
  auVar107._12_4_ = fVar239 * auVar22._12_4_;
  auVar103 = vfmsub231ps_fma(auVar107,auVar16,auVar187);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar65);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar65);
  auVar16 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar63);
  auVar22 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar12 + lVar13 * lVar2);
  auVar57 = *pauVar3;
  fVar144 = *(float *)pauVar3[1];
  lVar14 = *(long *)(lVar11 + 0x38 + lVar65);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar65);
  auVar275._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar275._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar275._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar275._12_4_ = fVar144 * 0.0;
  auVar187 = vfmadd231ps_fma(auVar275,auVar22,auVar295);
  auVar23 = vfmadd231ps_fma(auVar187,auVar16,auVar133);
  auVar187 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar60);
  auVar147 = vfnmadd231ps_fma(auVar23,auVar187,auVar295);
  auVar23 = *(undefined1 (*) [16])(lVar14 + lVar1 * lVar11);
  pfVar4 = (float *)(lVar14 + lVar11 * lVar2);
  fVar128 = *pfVar4;
  fVar145 = pfVar4[1];
  fVar146 = pfVar4[2];
  fVar143 = pfVar4[3];
  auVar223._8_4_ = 0x80000000;
  auVar223._0_8_ = 0x8000000080000000;
  auVar223._12_4_ = 0x80000000;
  auVar149._0_4_ = fVar128 * -0.0;
  auVar149._4_4_ = fVar145 * -0.0;
  auVar149._8_4_ = fVar146 * -0.0;
  auVar149._12_4_ = fVar143 * -0.0;
  auVar109 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar23,auVar149);
  auVar24 = *(undefined1 (*) [16])(lVar14 + lVar63 * lVar11);
  auVar183._0_4_ = auVar24._0_4_ + auVar109._0_4_;
  auVar183._4_4_ = auVar24._4_4_ + auVar109._4_4_;
  auVar183._8_4_ = auVar24._8_4_ + auVar109._8_4_;
  auVar183._12_4_ = auVar24._12_4_ + auVar109._12_4_;
  auVar109 = *(undefined1 (*) [16])(lVar14 + uVar60 * lVar11);
  auVar150 = vfmadd231ps_fma(auVar183,auVar109,auVar223);
  auVar133 = vshufps_avx(auVar150,auVar150,0xc9);
  fVar198 = auVar147._0_4_;
  auVar298._0_4_ = fVar198 * auVar133._0_4_;
  fVar220 = auVar147._4_4_;
  auVar298._4_4_ = fVar220 * auVar133._4_4_;
  fVar218 = auVar147._8_4_;
  auVar298._8_4_ = fVar218 * auVar133._8_4_;
  fVar219 = auVar147._12_4_;
  auVar298._12_4_ = fVar219 * auVar133._12_4_;
  auVar133 = vshufps_avx(auVar147,auVar147,0xc9);
  auVar129 = vfmsub231ps_fma(auVar298,auVar133,auVar150);
  auVar73._0_4_ = fVar128 * 0.0;
  auVar73._4_4_ = fVar145 * 0.0;
  auVar73._8_4_ = fVar146 * 0.0;
  auVar73._12_4_ = fVar143 * 0.0;
  auVar168._8_4_ = 0x3f000000;
  auVar168._0_8_ = 0x3f0000003f000000;
  auVar168._12_4_ = 0x3f000000;
  auVar150 = vfmadd231ps_fma(auVar73,auVar23,auVar168);
  auVar150 = vfmadd231ps_fma(auVar150,auVar24,ZEXT816(0) << 0x20);
  auVar132 = vfnmadd231ps_fma(auVar150,auVar109,auVar168);
  auVar150 = vshufps_avx(auVar132,auVar132,0xc9);
  auVar184._0_4_ = fVar198 * auVar150._0_4_;
  auVar184._4_4_ = fVar220 * auVar150._4_4_;
  auVar184._8_4_ = fVar218 * auVar150._8_4_;
  auVar184._12_4_ = fVar219 * auVar150._12_4_;
  auVar132 = vfmsub231ps_fma(auVar184,auVar133,auVar132);
  auVar74._0_4_ = auVar23._0_4_ + auVar149._0_4_;
  auVar74._4_4_ = auVar23._4_4_ + auVar149._4_4_;
  auVar74._8_4_ = auVar23._8_4_ + auVar149._8_4_;
  auVar74._12_4_ = auVar23._12_4_ + auVar149._12_4_;
  auVar108._0_4_ = fVar128 * 0.5;
  auVar108._4_4_ = fVar145 * 0.5;
  auVar108._8_4_ = fVar146 * 0.5;
  auVar108._12_4_ = fVar143 * 0.5;
  auVar150 = ZEXT416(0) << 0x20;
  auVar23 = vfmadd231ps_fma(auVar108,auVar150,auVar23);
  auVar133 = vfmadd231ps_fma(auVar74,auVar24,auVar150);
  auVar23 = vfnmadd231ps_fma(auVar23,auVar168,auVar24);
  auVar24 = vfmadd231ps_fma(auVar133,auVar109,auVar223);
  auVar109 = vfmadd231ps_fma(auVar23,auVar150,auVar109);
  auVar330._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar330._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar330._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar330._12_4_ = fVar144 * 0.5;
  auVar23 = vfmadd231ps_fma(auVar330,auVar150,auVar22);
  auVar23 = vfnmadd231ps_fma(auVar23,auVar168,auVar16);
  auVar133 = vfmadd231ps_fma(auVar23,auVar150,auVar187);
  auVar19._12_4_ = 0;
  auVar19._0_12_ = ZEXT812(0);
  auVar23 = vshufps_avx(auVar24,auVar24,0xc9);
  fVar329 = auVar133._0_4_;
  auVar151._0_4_ = fVar329 * auVar23._0_4_;
  fVar337 = auVar133._4_4_;
  auVar151._4_4_ = fVar337 * auVar23._4_4_;
  fVar338 = auVar133._8_4_;
  auVar151._8_4_ = fVar338 * auVar23._8_4_;
  fVar339 = auVar133._12_4_;
  auVar151._12_4_ = fVar339 * auVar23._12_4_;
  auVar23 = vshufps_avx(auVar133,auVar133,0xc9);
  auVar199 = vfmsub231ps_fma(auVar151,auVar23,auVar24);
  auVar24 = vshufps_avx(auVar109,auVar109,0xc9);
  auVar291._0_4_ = fVar329 * auVar24._0_4_;
  auVar291._4_4_ = fVar337 * auVar24._4_4_;
  auVar291._8_4_ = fVar338 * auVar24._8_4_;
  auVar291._12_4_ = fVar339 * auVar24._12_4_;
  auVar130 = vfmsub231ps_fma(auVar291,auVar23,auVar109);
  fVar100 = fVar100 - auVar17._0_4_;
  p02.field_0.i[0] = auVar56._0_4_;
  p02.field_0.i[1] = auVar56._4_4_;
  p02.field_0.i[2] = auVar56._8_4_;
  auVar75._0_4_ = p02.field_0.v[0] * -0.0;
  auVar75._4_4_ = p02.field_0.v[1] * -0.0;
  auVar75._8_4_ = p02.field_0.v[2] * -0.0;
  auVar75._12_4_ = fVar67 * -0.0;
  auVar23 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar21,auVar75);
  auVar169._0_4_ = auVar21._0_4_ + auVar75._0_4_;
  auVar169._4_4_ = auVar21._4_4_ + auVar75._4_4_;
  auVar169._8_4_ = auVar21._8_4_ + auVar75._8_4_;
  auVar169._12_4_ = auVar21._12_4_ + auVar75._12_4_;
  auVar185._0_4_ = auVar20._0_4_ + auVar23._0_4_;
  auVar185._4_4_ = auVar20._4_4_ + auVar23._4_4_;
  auVar185._8_4_ = auVar20._8_4_ + auVar23._8_4_;
  auVar185._12_4_ = auVar20._12_4_ + auVar23._12_4_;
  auVar24 = vpermilps_avx(auVar71,0xc9);
  auVar21 = vdpps_avx(auVar24,auVar24,0x7f);
  auVar20 = vfmadd231ps_fma(auVar169,auVar20,auVar19 << 0x20);
  auVar17 = vfmadd231ps_fma(auVar185,auVar122,auVar223);
  auVar150 = vfmadd231ps_fma(auVar20,auVar122,auVar223);
  fVar128 = auVar21._0_4_;
  auVar109 = ZEXT416((uint)fVar128);
  auVar122 = vrsqrtss_avx(auVar109,auVar109);
  fVar67 = auVar122._0_4_;
  fVar67 = fVar67 * 1.5 + fVar67 * fVar67 * fVar128 * -0.5 * fVar67;
  auVar20 = vpermilps_avx(auVar72,0xc9);
  auVar122 = vdpps_avx(auVar24,auVar20,0x7f);
  auVar224._0_4_ = fVar128 * auVar20._0_4_;
  auVar224._4_4_ = fVar128 * auVar20._4_4_;
  auVar224._8_4_ = fVar128 * auVar20._8_4_;
  auVar224._12_4_ = fVar128 * auVar20._12_4_;
  fVar128 = auVar122._0_4_;
  auVar261._0_4_ = fVar128 * auVar24._0_4_;
  auVar261._4_4_ = fVar128 * auVar24._4_4_;
  auVar261._8_4_ = fVar128 * auVar24._8_4_;
  auVar261._12_4_ = fVar128 * auVar24._12_4_;
  auVar23 = vsubps_avx(auVar224,auVar261);
  auVar122 = vrcpss_avx(auVar109,auVar109);
  auVar20 = vfnmadd213ss_fma(auVar21,auVar122,SUB6416(ZEXT464(0x40000000),0));
  fVar145 = auVar122._0_4_ * auVar20._0_4_;
  auVar109 = vpermilps_avx(auVar102,0xc9);
  auVar20 = vdpps_avx(auVar109,auVar109,0x7f);
  fVar243 = auVar24._0_4_ * fVar67;
  fVar258 = auVar24._4_4_ * fVar67;
  fVar259 = auVar24._8_4_ * fVar67;
  fVar260 = auVar24._12_4_ * fVar67;
  auVar24 = vpermilps_avx(auVar103,0xc9);
  auVar122 = vblendps_avx(auVar20,_DAT_01f45a50,0xe);
  auVar21 = vrsqrtss_avx(auVar122,auVar122);
  fVar146 = auVar20._0_4_;
  fVar128 = auVar21._0_4_;
  auVar21 = vdpps_avx(auVar109,auVar24,0x7f);
  fVar128 = fVar128 * 1.5 + fVar128 * fVar146 * -0.5 * fVar128 * fVar128;
  auVar110._0_4_ = fVar146 * auVar24._0_4_;
  auVar110._4_4_ = fVar146 * auVar24._4_4_;
  auVar110._8_4_ = fVar146 * auVar24._8_4_;
  auVar110._12_4_ = fVar146 * auVar24._12_4_;
  fVar146 = auVar21._0_4_;
  auVar134._0_4_ = fVar146 * auVar109._0_4_;
  auVar134._4_4_ = fVar146 * auVar109._4_4_;
  auVar134._8_4_ = fVar146 * auVar109._8_4_;
  auVar134._12_4_ = fVar146 * auVar109._12_4_;
  auVar21 = vsubps_avx(auVar110,auVar134);
  auVar122 = vrcpss_avx(auVar122,auVar122);
  auVar20 = vfnmadd213ss_fma(auVar20,auVar122,ZEXT416(0x40000000));
  fVar146 = auVar122._0_4_ * auVar20._0_4_;
  fVar143 = auVar109._0_4_ * fVar128;
  fVar164 = auVar109._4_4_ * fVar128;
  fVar165 = auVar109._8_4_ * fVar128;
  fVar166 = auVar109._12_4_ * fVar128;
  auVar122 = vshufps_avx(auVar131,auVar131,0xff);
  auVar20 = vshufps_avx(auVar17,auVar17,0xff);
  auVar203._0_4_ = fVar243 * auVar20._0_4_;
  auVar203._4_4_ = fVar258 * auVar20._4_4_;
  auVar203._8_4_ = fVar259 * auVar20._8_4_;
  auVar203._12_4_ = fVar260 * auVar20._12_4_;
  auVar111._0_4_ = fVar243 * auVar122._0_4_ + fVar67 * fVar145 * auVar23._0_4_ * auVar20._0_4_;
  auVar111._4_4_ = fVar258 * auVar122._4_4_ + fVar67 * fVar145 * auVar23._4_4_ * auVar20._4_4_;
  auVar111._8_4_ = fVar259 * auVar122._8_4_ + fVar67 * fVar145 * auVar23._8_4_ * auVar20._8_4_;
  auVar111._12_4_ = fVar260 * auVar122._12_4_ + fVar67 * fVar145 * auVar23._12_4_ * auVar20._12_4_;
  auVar23 = vsubps_avx(auVar17,auVar203);
  p00.field_0.v[0] = auVar17._0_4_ + auVar203._0_4_;
  p00.field_0.v[1] = auVar17._4_4_ + auVar203._4_4_;
  p00.field_0.v[2] = auVar17._8_4_ + auVar203._8_4_;
  p00.field_0.v[3] = auVar17._12_4_ + auVar203._12_4_;
  auVar24 = vsubps_avx(auVar131,auVar111);
  auVar122 = vshufps_avx(auVar69,auVar69,0xff);
  auVar20 = vshufps_avx(auVar150,auVar150,0xff);
  auVar152._0_4_ = auVar20._0_4_ * fVar143;
  auVar152._4_4_ = auVar20._4_4_ * fVar164;
  auVar152._8_4_ = auVar20._8_4_ * fVar165;
  auVar152._12_4_ = auVar20._12_4_ * fVar166;
  auVar186._0_4_ = auVar122._0_4_ * fVar143 + auVar20._0_4_ * fVar128 * auVar21._0_4_ * fVar146;
  auVar186._4_4_ = auVar122._4_4_ * fVar164 + auVar20._4_4_ * fVar128 * auVar21._4_4_ * fVar146;
  auVar186._8_4_ = auVar122._8_4_ * fVar165 + auVar20._8_4_ * fVar128 * auVar21._8_4_ * fVar146;
  auVar186._12_4_ = auVar122._12_4_ * fVar166 + auVar20._12_4_ * fVar128 * auVar21._12_4_ * fVar146;
  auVar21 = vsubps_avx(auVar150,auVar152);
  p02.field_0.v[1] = auVar150._4_4_ + auVar152._4_4_;
  p02.field_0.v[0] = auVar150._0_4_ + auVar152._0_4_;
  p02.field_0.v[2] = auVar150._8_4_ + auVar152._8_4_;
  p02.field_0.v[3] = auVar150._12_4_ + auVar152._12_4_;
  auVar109 = vsubps_avx(auVar69,auVar186);
  auVar76._8_4_ = 0x80000000;
  auVar76._0_8_ = 0x8000000080000000;
  auVar76._12_4_ = 0x80000000;
  local_5d8 = auVar57._0_4_;
  fStack_5d4 = auVar57._4_4_;
  fStack_5d0 = auVar57._8_4_;
  auVar153._0_4_ = local_5d8 * -0.0;
  auVar153._4_4_ = fStack_5d4 * -0.0;
  auVar153._8_4_ = fStack_5d0 * -0.0;
  auVar153._12_4_ = fVar144 * -0.0;
  auVar122 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar22,auVar153);
  auVar225._0_4_ = auVar22._0_4_ + auVar153._0_4_;
  auVar225._4_4_ = auVar22._4_4_ + auVar153._4_4_;
  auVar225._8_4_ = auVar22._8_4_ + auVar153._8_4_;
  auVar225._12_4_ = auVar22._12_4_ + auVar153._12_4_;
  auVar321._0_4_ = auVar16._0_4_ + auVar122._0_4_;
  auVar321._4_4_ = auVar16._4_4_ + auVar122._4_4_;
  auVar321._8_4_ = auVar16._8_4_ + auVar122._8_4_;
  auVar321._12_4_ = auVar16._12_4_ + auVar122._12_4_;
  auVar20 = vfmadd231ps_fma(auVar225,auVar16,ZEXT816(0) << 0x20);
  auVar17 = vfmadd231ps_fma(auVar321,auVar187,auVar76);
  auVar22 = vpermilps_avx(auVar129,0xc9);
  auVar122 = vdpps_avx(auVar22,auVar22,0x7f);
  auVar150 = vfmadd231ps_fma(auVar20,auVar187,auVar76);
  fVar128 = auVar122._0_4_;
  auVar187 = ZEXT416((uint)fVar128);
  auVar20 = vrsqrtss_avx(auVar187,auVar187);
  fVar67 = auVar20._0_4_;
  fVar67 = fVar128 * -0.5 * fVar67 * fVar67 * fVar67 + fVar67 * 1.5;
  auVar20 = vpermilps_avx(auVar132,0xc9);
  auVar262._0_4_ = fVar128 * auVar20._0_4_;
  auVar262._4_4_ = fVar128 * auVar20._4_4_;
  auVar262._8_4_ = fVar128 * auVar20._8_4_;
  auVar262._12_4_ = fVar128 * auVar20._12_4_;
  auVar20 = vdpps_avx(auVar22,auVar20,0x7f);
  fVar128 = auVar20._0_4_;
  auVar249._0_4_ = fVar128 * auVar22._0_4_;
  auVar249._4_4_ = fVar128 * auVar22._4_4_;
  auVar249._8_4_ = fVar128 * auVar22._8_4_;
  auVar249._12_4_ = fVar128 * auVar22._12_4_;
  auVar16 = vsubps_avx(auVar262,auVar249);
  auVar20 = vrcpss_avx(auVar187,auVar187);
  auVar122 = vfnmadd213ss_fma(auVar122,auVar20,SUB6416(ZEXT464(0x40000000),0));
  fVar145 = auVar20._0_4_ * auVar122._0_4_;
  fVar144 = auVar22._0_4_ * fVar67;
  fVar143 = auVar22._4_4_ * fVar67;
  fVar164 = auVar22._8_4_ * fVar67;
  fVar165 = auVar22._12_4_ * fVar67;
  auVar187 = vpermilps_avx(auVar199,0xc9);
  auVar122 = vdpps_avx(auVar187,auVar187,0x7f);
  fVar146 = auVar122._0_4_;
  auVar69 = ZEXT416((uint)fVar146);
  auVar20 = vrsqrtss_avx(auVar69,auVar69);
  fVar128 = auVar20._0_4_;
  auVar22 = vpermilps_avx(auVar130,0xc9);
  auVar20 = vdpps_avx(auVar187,auVar22,0x7f);
  fVar128 = fVar128 * 1.5 + fVar146 * -0.5 * fVar128 * fVar128 * fVar128;
  auVar296._0_4_ = fVar146 * auVar22._0_4_;
  auVar296._4_4_ = fVar146 * auVar22._4_4_;
  auVar296._8_4_ = fVar146 * auVar22._8_4_;
  auVar296._12_4_ = fVar146 * auVar22._12_4_;
  fVar146 = auVar20._0_4_;
  auVar157._0_4_ = fVar146 * auVar187._0_4_;
  auVar157._4_4_ = fVar146 * auVar187._4_4_;
  auVar157._8_4_ = fVar146 * auVar187._8_4_;
  auVar157._12_4_ = fVar146 * auVar187._12_4_;
  auVar22 = vsubps_avx(auVar296,auVar157);
  auVar20 = vrcpss_avx(auVar69,auVar69);
  auVar122 = vfnmadd213ss_fma(auVar122,auVar20,SUB6416(ZEXT464(0x40000000),0));
  fVar146 = auVar20._0_4_ * auVar122._0_4_;
  fVar166 = auVar187._0_4_ * fVar128;
  fVar243 = auVar187._4_4_ * fVar128;
  fVar258 = auVar187._8_4_ * fVar128;
  fVar259 = auVar187._12_4_ * fVar128;
  auVar122 = vshufps_avx(auVar147,auVar147,0xff);
  auVar20 = vshufps_avx(auVar17,auVar17,0xff);
  auVar154._0_4_ = auVar20._0_4_ * fVar144;
  auVar154._4_4_ = auVar20._4_4_ * fVar143;
  auVar154._8_4_ = auVar20._8_4_ * fVar164;
  auVar154._12_4_ = auVar20._12_4_ * fVar165;
  auVar170._0_4_ = auVar122._0_4_ * fVar144 + auVar20._0_4_ * fVar67 * auVar16._0_4_ * fVar145;
  auVar170._4_4_ = auVar122._4_4_ * fVar143 + auVar20._4_4_ * fVar67 * auVar16._4_4_ * fVar145;
  auVar170._8_4_ = auVar122._8_4_ * fVar164 + auVar20._8_4_ * fVar67 * auVar16._8_4_ * fVar145;
  auVar170._12_4_ = auVar122._12_4_ * fVar165 + auVar20._12_4_ * fVar67 * auVar16._12_4_ * fVar145;
  auVar16 = vsubps_avx(auVar17,auVar154);
  fVar145 = auVar17._0_4_ + auVar154._0_4_;
  fVar144 = auVar17._4_4_ + auVar154._4_4_;
  fVar143 = auVar17._8_4_ + auVar154._8_4_;
  fVar164 = auVar17._12_4_ + auVar154._12_4_;
  auVar187 = vsubps_avx(auVar147,auVar170);
  auVar122 = vshufps_avx(auVar133,auVar133,0xff);
  auVar20 = vshufps_avx(auVar150,auVar150,0xff);
  auVar250._0_4_ = fVar166 * auVar20._0_4_;
  auVar250._4_4_ = fVar243 * auVar20._4_4_;
  auVar250._8_4_ = fVar258 * auVar20._8_4_;
  auVar250._12_4_ = fVar259 * auVar20._12_4_;
  auVar77._0_4_ = fVar166 * auVar122._0_4_ + auVar20._0_4_ * fVar128 * auVar22._0_4_ * fVar146;
  auVar77._4_4_ = fVar243 * auVar122._4_4_ + auVar20._4_4_ * fVar128 * auVar22._4_4_ * fVar146;
  auVar77._8_4_ = fVar258 * auVar122._8_4_ + auVar20._8_4_ * fVar128 * auVar22._8_4_ * fVar146;
  auVar77._12_4_ = fVar259 * auVar122._12_4_ + auVar20._12_4_ * fVar128 * auVar22._12_4_ * fVar146;
  auVar122 = vsubps_avx(auVar150,auVar250);
  auVar171._0_4_ = auVar250._0_4_ + auVar150._0_4_;
  auVar171._4_4_ = auVar250._4_4_ + auVar150._4_4_;
  auVar171._8_4_ = auVar250._8_4_ + auVar150._8_4_;
  auVar171._12_4_ = auVar250._12_4_ + auVar150._12_4_;
  auVar20 = vsubps_avx(auVar133,auVar77);
  local_528 = auVar24._0_4_;
  fStack_524 = auVar24._4_4_;
  fStack_520 = auVar24._8_4_;
  fStack_51c = auVar24._12_4_;
  auVar78._0_4_ = auVar23._0_4_ + local_528 * 0.33333334;
  auVar78._4_4_ = auVar23._4_4_ + fStack_524 * 0.33333334;
  auVar78._8_4_ = auVar23._8_4_ + fStack_520 * 0.33333334;
  auVar78._12_4_ = auVar23._12_4_ + fStack_51c * 0.33333334;
  fVar67 = 1.0 - fVar100;
  auVar226._4_4_ = fVar67;
  auVar226._0_4_ = fVar67;
  auVar226._8_4_ = fVar67;
  auVar226._12_4_ = fVar67;
  auVar297._0_4_ = fVar100 * auVar16._0_4_;
  auVar297._4_4_ = fVar100 * auVar16._4_4_;
  auVar297._8_4_ = fVar100 * auVar16._8_4_;
  auVar297._12_4_ = fVar100 * auVar16._12_4_;
  auVar130 = vfmadd231ps_fma(auVar297,auVar226,auVar23);
  auVar135._0_4_ = fVar100 * (auVar16._0_4_ + auVar187._0_4_ * 0.33333334);
  auVar135._4_4_ = fVar100 * (auVar16._4_4_ + auVar187._4_4_ * 0.33333334);
  auVar135._8_4_ = fVar100 * (auVar16._8_4_ + auVar187._8_4_ * 0.33333334);
  auVar135._12_4_ = fVar100 * (auVar16._12_4_ + auVar187._12_4_ * 0.33333334);
  auVar131 = vfmadd231ps_fma(auVar135,auVar226,auVar78);
  local_558._0_4_ = auVar109._0_4_;
  local_558._4_4_ = auVar109._4_4_;
  uStack_550._0_4_ = auVar109._8_4_;
  uStack_550._4_4_ = auVar109._12_4_;
  auVar79._0_4_ = (float)local_558._0_4_ * 0.33333334;
  auVar79._4_4_ = (float)local_558._4_4_ * 0.33333334;
  auVar79._8_4_ = (float)uStack_550 * 0.33333334;
  auVar79._12_4_ = uStack_550._4_4_ * 0.33333334;
  auVar16 = vsubps_avx(auVar21,auVar79);
  auVar310._0_4_ = p00.field_0.v[0] + (fVar240 + auVar111._0_4_) * 0.33333334;
  auVar310._4_4_ = p00.field_0.v[1] + (fVar241 + auVar111._4_4_) * 0.33333334;
  auVar310._8_4_ = p00.field_0.v[2] + (fVar242 + auVar111._8_4_) * 0.33333334;
  auVar310._12_4_ = p00.field_0.v[3] + (fVar99 + auVar111._12_4_) * 0.33333334;
  auVar290._0_4_ = (fVar236 + auVar186._0_4_) * 0.33333334;
  auVar290._4_4_ = (fVar237 + auVar186._4_4_) * 0.33333334;
  auVar290._8_4_ = (fVar238 + auVar186._8_4_) * 0.33333334;
  auVar290._12_4_ = (fVar239 + auVar186._12_4_) * 0.33333334;
  auVar22 = vsubps_avx((undefined1  [16])p02.field_0,auVar290);
  auVar276._0_4_ = auVar20._0_4_ * 0.33333334;
  auVar276._4_4_ = auVar20._4_4_ * 0.33333334;
  auVar276._8_4_ = auVar20._8_4_ * 0.33333334;
  auVar276._12_4_ = auVar20._12_4_ * 0.33333334;
  auVar20 = vsubps_avx(auVar122,auVar276);
  auVar251._0_4_ = (fVar329 + auVar77._0_4_) * 0.33333334;
  auVar251._4_4_ = (fVar337 + auVar77._4_4_) * 0.33333334;
  auVar251._8_4_ = (fVar338 + auVar77._8_4_) * 0.33333334;
  auVar251._12_4_ = (fVar339 + auVar77._12_4_) * 0.33333334;
  auVar187 = vsubps_avx(auVar171,auVar251);
  auVar277._0_4_ = fVar100 * auVar20._0_4_;
  auVar277._4_4_ = fVar100 * auVar20._4_4_;
  auVar277._8_4_ = fVar100 * auVar20._8_4_;
  auVar277._12_4_ = fVar100 * auVar20._12_4_;
  auVar204._0_4_ = fVar100 * auVar122._0_4_;
  auVar204._4_4_ = fVar100 * auVar122._4_4_;
  auVar204._8_4_ = fVar100 * auVar122._8_4_;
  auVar204._12_4_ = fVar100 * auVar122._12_4_;
  auVar147 = vfmadd231ps_fma(auVar277,auVar226,auVar16);
  auVar167 = vfmadd231ps_fma(auVar204,auVar226,auVar21);
  auVar80._0_4_ = fVar100 * fVar145;
  auVar80._4_4_ = fVar100 * fVar144;
  auVar80._8_4_ = fVar100 * fVar143;
  auVar80._12_4_ = fVar100 * fVar164;
  auVar112._0_4_ = fVar100 * (fVar145 + (fVar198 + auVar170._0_4_) * 0.33333334);
  auVar112._4_4_ = fVar100 * (fVar144 + (fVar220 + auVar170._4_4_) * 0.33333334);
  auVar112._8_4_ = fVar100 * (fVar143 + (fVar218 + auVar170._8_4_) * 0.33333334);
  auVar112._12_4_ = fVar100 * (fVar164 + (fVar219 + auVar170._12_4_) * 0.33333334);
  auVar155._0_4_ = fVar100 * auVar187._0_4_;
  auVar155._4_4_ = fVar100 * auVar187._4_4_;
  auVar155._8_4_ = fVar100 * auVar187._8_4_;
  auVar155._12_4_ = fVar100 * auVar187._12_4_;
  auVar172._0_4_ = fVar100 * auVar171._0_4_;
  auVar172._4_4_ = fVar100 * auVar171._4_4_;
  auVar172._8_4_ = fVar100 * auVar171._8_4_;
  auVar172._12_4_ = fVar100 * auVar171._12_4_;
  auVar181 = vfmadd231ps_fma(auVar80,auVar226,(undefined1  [16])p00.field_0);
  auVar221 = vfmadd231ps_fma(auVar112,auVar226,auVar310);
  auVar244 = vfmadd231ps_fma(auVar155,auVar226,auVar22);
  auVar245 = vfmadd231ps_fma(auVar172,auVar226,(undefined1  [16])p02.field_0);
  auVar122 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar122 = vinsertps_avx(auVar122,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar24 = vsubps_avx(auVar130,auVar122);
  auVar20 = vshufps_avx(auVar24,auVar24,0x55);
  auVar21 = vshufps_avx(auVar24,auVar24,0xaa);
  aVar6 = pre->ray_space[k].vy.field_0;
  fVar67 = pre->ray_space[k].vz.field_0.m128[0];
  fVar128 = pre->ray_space[k].vz.field_0.m128[1];
  fVar100 = pre->ray_space[k].vz.field_0.m128[2];
  fVar145 = pre->ray_space[k].vz.field_0.m128[3];
  auVar81._0_4_ = fVar67 * auVar21._0_4_;
  auVar81._4_4_ = fVar128 * auVar21._4_4_;
  auVar81._8_4_ = fVar100 * auVar21._8_4_;
  auVar81._12_4_ = fVar145 * auVar21._12_4_;
  auVar16 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar6,auVar20);
  auVar109 = vsubps_avx(auVar131,auVar122);
  auVar20 = vshufps_avx(auVar109,auVar109,0x55);
  auVar21 = vshufps_avx(auVar109,auVar109,0xaa);
  auVar331._0_4_ = fVar67 * auVar21._0_4_;
  auVar331._4_4_ = fVar128 * auVar21._4_4_;
  auVar331._8_4_ = fVar100 * auVar21._8_4_;
  auVar331._12_4_ = fVar145 * auVar21._12_4_;
  auVar21 = vfmadd231ps_fma(auVar331,(undefined1  [16])aVar6,auVar20);
  auVar17 = vsubps_avx(auVar147,auVar122);
  auVar20 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar311._0_4_ = fVar67 * auVar20._0_4_;
  auVar311._4_4_ = fVar128 * auVar20._4_4_;
  auVar311._8_4_ = fVar100 * auVar20._8_4_;
  auVar311._12_4_ = fVar145 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar17,auVar17,0x55);
  auVar22 = vfmadd231ps_fma(auVar311,(undefined1  [16])aVar6,auVar20);
  auVar133 = vsubps_avx(auVar167,auVar122);
  auVar20 = vshufps_avx(auVar133,auVar133,0xaa);
  auVar322._0_4_ = fVar67 * auVar20._0_4_;
  auVar322._4_4_ = fVar128 * auVar20._4_4_;
  auVar322._8_4_ = fVar100 * auVar20._8_4_;
  auVar322._12_4_ = fVar145 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar133,auVar133,0x55);
  auVar187 = vfmadd231ps_fma(auVar322,(undefined1  [16])aVar6,auVar20);
  auVar150 = vsubps_avx(auVar181,auVar122);
  auVar20 = vshufps_avx(auVar150,auVar150,0xaa);
  auVar173._0_4_ = fVar67 * auVar20._0_4_;
  auVar173._4_4_ = fVar128 * auVar20._4_4_;
  auVar173._8_4_ = fVar100 * auVar20._8_4_;
  auVar173._12_4_ = fVar145 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar150,auVar150,0x55);
  auVar23 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar6,auVar20);
  auVar69 = vsubps_avx(auVar221,auVar122);
  auVar20 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar227._0_4_ = fVar67 * auVar20._0_4_;
  auVar227._4_4_ = fVar128 * auVar20._4_4_;
  auVar227._8_4_ = fVar100 * auVar20._8_4_;
  auVar227._12_4_ = fVar145 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar69,auVar69,0x55);
  auVar102 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar6,auVar20);
  auVar71 = vsubps_avx(auVar244,auVar122);
  auVar20 = vshufps_avx(auVar71,auVar71,0xaa);
  auVar263._0_4_ = fVar67 * auVar20._0_4_;
  auVar263._4_4_ = fVar128 * auVar20._4_4_;
  auVar263._8_4_ = fVar100 * auVar20._8_4_;
  auVar263._12_4_ = fVar145 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar71,auVar71,0x55);
  auVar20 = vfmadd231ps_fma(auVar263,(undefined1  [16])aVar6,auVar20);
  auVar72 = vsubps_avx(auVar245,auVar122);
  auVar122 = vshufps_avx(auVar72,auVar72,0xaa);
  auVar188._0_4_ = fVar67 * auVar122._0_4_;
  auVar188._4_4_ = fVar128 * auVar122._4_4_;
  auVar188._8_4_ = fVar100 * auVar122._8_4_;
  auVar188._12_4_ = fVar145 * auVar122._12_4_;
  auVar122 = vshufps_avx(auVar72,auVar72,0x55);
  auVar122 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar6,auVar122);
  local_3c8 = auVar24._0_4_;
  auVar205._4_4_ = local_3c8;
  auVar205._0_4_ = local_3c8;
  auVar205._8_4_ = local_3c8;
  auVar205._12_4_ = local_3c8;
  aVar6 = pre->ray_space[k].vx.field_0;
  auVar103 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar6,auVar205);
  local_3d8 = auVar109._0_4_;
  auVar206._4_4_ = local_3d8;
  auVar206._0_4_ = local_3d8;
  auVar206._8_4_ = local_3d8;
  auVar206._12_4_ = local_3d8;
  auVar129 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar6,auVar206);
  uVar68 = auVar17._0_4_;
  auVar207._4_4_ = uVar68;
  auVar207._0_4_ = uVar68;
  auVar207._8_4_ = uVar68;
  auVar207._12_4_ = uVar68;
  auVar132 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar6,auVar207);
  uVar68 = auVar133._0_4_;
  auVar208._4_4_ = uVar68;
  auVar208._0_4_ = uVar68;
  auVar208._8_4_ = uVar68;
  auVar208._12_4_ = uVar68;
  auVar199 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar6,auVar208);
  uVar68 = auVar150._0_4_;
  auVar209._4_4_ = uVar68;
  auVar209._0_4_ = uVar68;
  auVar209._8_4_ = uVar68;
  auVar209._12_4_ = uVar68;
  auVar246 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar6,auVar209);
  uVar68 = auVar69._0_4_;
  auVar210._4_4_ = uVar68;
  auVar210._0_4_ = uVar68;
  auVar210._8_4_ = uVar68;
  auVar210._12_4_ = uVar68;
  auVar272 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar6,auVar210);
  uVar68 = auVar71._0_4_;
  auVar211._4_4_ = uVar68;
  auVar211._0_4_ = uVar68;
  auVar211._8_4_ = uVar68;
  auVar211._12_4_ = uVar68;
  auVar273 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar6,auVar211);
  uVar68 = auVar72._0_4_;
  auVar212._4_4_ = uVar68;
  auVar212._0_4_ = uVar68;
  auVar212._8_4_ = uVar68;
  auVar212._12_4_ = uVar68;
  auVar274 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar6,auVar212);
  auVar16 = vmovlhps_avx(auVar103,auVar246);
  auVar22 = vmovlhps_avx(auVar129,auVar272);
  auVar187 = vmovlhps_avx(auVar132,auVar273);
  auVar23 = vmovlhps_avx(auVar199,auVar274);
  auVar122 = vminps_avx(auVar16,auVar22);
  auVar20 = vminps_avx(auVar187,auVar23);
  auVar21 = vminps_avx(auVar122,auVar20);
  auVar122 = vmaxps_avx(auVar16,auVar22);
  auVar20 = vmaxps_avx(auVar187,auVar23);
  auVar122 = vmaxps_avx(auVar122,auVar20);
  auVar20 = vshufpd_avx(auVar21,auVar21,3);
  auVar21 = vminps_avx(auVar21,auVar20);
  auVar20 = vshufpd_avx(auVar122,auVar122,3);
  auVar20 = vmaxps_avx(auVar122,auVar20);
  auVar122 = vandps_avx(auVar70,auVar21);
  auVar20 = vandps_avx(auVar20,auVar70);
  auVar122 = vmaxps_avx(auVar122,auVar20);
  auVar20 = vmovshdup_avx(auVar122);
  auVar122 = vmaxss_avx(auVar20,auVar122);
  fVar128 = auVar122._0_4_ * 9.536743e-07;
  auVar252._8_8_ = auVar103._0_8_;
  auVar252._0_8_ = auVar103._0_8_;
  auVar278._8_8_ = auVar129._0_8_;
  auVar278._0_8_ = auVar129._0_8_;
  auVar312._0_8_ = auVar132._0_8_;
  auVar312._8_8_ = auVar312._0_8_;
  auVar323._0_8_ = auVar199._0_8_;
  auVar323._8_8_ = auVar323._0_8_;
  local_78 = fVar128;
  fStack_74 = fVar128;
  fStack_70 = fVar128;
  fStack_6c = fVar128;
  fStack_68 = fVar128;
  fStack_64 = fVar128;
  fStack_60 = fVar128;
  fStack_5c = fVar128;
  fStack_90 = -fVar128;
  local_98 = -fVar128;
  fStack_94 = -fVar128;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar60 = 0;
  fVar67 = *(float *)(ray + k * 4 + 0x30);
  auVar20 = vsubps_avx(auVar22,auVar16);
  auVar21 = vsubps_avx(auVar187,auVar22);
  auVar102 = vsubps_avx(auVar23,auVar187);
  auVar103 = vsubps_avx(auVar181,auVar130);
  auVar129 = vsubps_avx(auVar221,auVar131);
  auVar132 = vsubps_avx(auVar244,auVar147);
  auVar199 = vsubps_avx(auVar245,auVar167);
  auVar82 = ZEXT816(0x3f80000000000000);
  auVar122 = auVar82;
LAB_01294075:
  auVar306 = vshufps_avx(auVar82,auVar82,0x50);
  auVar332._8_4_ = 0x3f800000;
  auVar332._0_8_ = 0x3f8000003f800000;
  auVar332._12_4_ = 0x3f800000;
  auVar335._16_4_ = 0x3f800000;
  auVar335._0_16_ = auVar332;
  auVar335._20_4_ = 0x3f800000;
  auVar335._24_4_ = 0x3f800000;
  auVar335._28_4_ = 0x3f800000;
  auVar307 = vsubps_avx(auVar332,auVar306);
  fVar100 = auVar306._0_4_;
  fVar243 = auVar246._0_4_;
  auVar83._0_4_ = fVar243 * fVar100;
  fVar145 = auVar306._4_4_;
  fVar258 = auVar246._4_4_;
  auVar83._4_4_ = fVar258 * fVar145;
  fVar146 = auVar306._8_4_;
  auVar83._8_4_ = fVar243 * fVar146;
  fVar144 = auVar306._12_4_;
  auVar83._12_4_ = fVar258 * fVar144;
  fVar198 = auVar272._0_4_;
  auVar213._0_4_ = fVar198 * fVar100;
  fVar218 = auVar272._4_4_;
  auVar213._4_4_ = fVar218 * fVar145;
  auVar213._8_4_ = fVar198 * fVar146;
  auVar213._12_4_ = fVar218 * fVar144;
  fVar219 = auVar273._0_4_;
  auVar174._0_4_ = fVar219 * fVar100;
  fVar236 = auVar273._4_4_;
  auVar174._4_4_ = fVar236 * fVar145;
  auVar174._8_4_ = fVar219 * fVar146;
  auVar174._12_4_ = fVar236 * fVar144;
  fVar259 = auVar274._0_4_;
  auVar136._0_4_ = fVar259 * fVar100;
  fVar260 = auVar274._4_4_;
  auVar136._4_4_ = fVar260 * fVar145;
  auVar136._8_4_ = fVar259 * fVar146;
  auVar136._12_4_ = fVar260 * fVar144;
  auVar298 = vfmadd231ps_fma(auVar83,auVar307,auVar252);
  auVar73 = vfmadd231ps_fma(auVar213,auVar307,auVar278);
  auVar74 = vfmadd231ps_fma(auVar174,auVar307,auVar312);
  auVar291 = vfmadd231ps_fma(auVar136,auVar323,auVar307);
  auVar306 = vmovshdup_avx(auVar122);
  fVar100 = auVar122._0_4_;
  fStack_140 = (auVar306._0_4_ - fVar100) * 0.04761905;
  auVar271._4_4_ = fVar100;
  auVar271._0_4_ = fVar100;
  auVar271._8_4_ = fVar100;
  auVar271._12_4_ = fVar100;
  auVar271._16_4_ = fVar100;
  auVar271._20_4_ = fVar100;
  auVar271._24_4_ = fVar100;
  auVar271._28_4_ = fVar100;
  auVar123._0_8_ = auVar306._0_8_;
  auVar123._8_8_ = auVar123._0_8_;
  auVar123._16_8_ = auVar123._0_8_;
  auVar123._24_8_ = auVar123._0_8_;
  auVar96 = vsubps_avx(auVar123,auVar271);
  uVar68 = auVar298._0_4_;
  auVar327._4_4_ = uVar68;
  auVar327._0_4_ = uVar68;
  auVar327._8_4_ = uVar68;
  auVar327._12_4_ = uVar68;
  auVar327._16_4_ = uVar68;
  auVar327._20_4_ = uVar68;
  auVar327._24_4_ = uVar68;
  auVar327._28_4_ = uVar68;
  auVar306 = vmovshdup_avx(auVar298);
  uVar101 = auVar306._0_8_;
  auVar320._8_8_ = uVar101;
  auVar320._0_8_ = uVar101;
  auVar320._16_8_ = uVar101;
  auVar320._24_8_ = uVar101;
  fVar220 = auVar73._0_4_;
  auVar303._4_4_ = fVar220;
  auVar303._0_4_ = fVar220;
  auVar303._8_4_ = fVar220;
  auVar303._12_4_ = fVar220;
  auVar303._16_4_ = fVar220;
  auVar303._20_4_ = fVar220;
  auVar303._24_4_ = fVar220;
  auVar303._28_4_ = fVar220;
  auVar307 = vmovshdup_avx(auVar73);
  auVar124._0_8_ = auVar307._0_8_;
  auVar124._8_8_ = auVar124._0_8_;
  auVar124._16_8_ = auVar124._0_8_;
  auVar124._24_8_ = auVar124._0_8_;
  fVar166 = auVar74._0_4_;
  auVar233._4_4_ = fVar166;
  auVar233._0_4_ = fVar166;
  auVar233._8_4_ = fVar166;
  auVar233._12_4_ = fVar166;
  auVar233._16_4_ = fVar166;
  auVar233._20_4_ = fVar166;
  auVar233._24_4_ = fVar166;
  auVar233._28_4_ = fVar166;
  auVar308 = vmovshdup_avx(auVar74);
  auVar256._0_8_ = auVar308._0_8_;
  auVar256._8_8_ = auVar256._0_8_;
  auVar256._16_8_ = auVar256._0_8_;
  auVar256._24_8_ = auVar256._0_8_;
  fVar165 = auVar291._0_4_;
  auVar19 = vmovshdup_avx(auVar291);
  auVar75 = vfmadd132ps_fma(auVar96,auVar271,_DAT_01f7b040);
  auVar96 = vsubps_avx(auVar335,ZEXT1632(auVar75));
  fVar100 = auVar75._0_4_;
  fVar145 = auVar75._4_4_;
  auVar25._4_4_ = fVar220 * fVar145;
  auVar25._0_4_ = fVar220 * fVar100;
  fVar146 = auVar75._8_4_;
  auVar25._8_4_ = fVar220 * fVar146;
  fVar144 = auVar75._12_4_;
  auVar25._12_4_ = fVar220 * fVar144;
  auVar25._16_4_ = fVar220 * 0.0;
  auVar25._20_4_ = fVar220 * 0.0;
  auVar25._24_4_ = fVar220 * 0.0;
  auVar25._28_4_ = 0x3f800000;
  auVar75 = vfmadd231ps_fma(auVar25,auVar96,auVar327);
  fVar143 = auVar307._0_4_;
  fVar164 = auVar307._4_4_;
  auVar26._4_4_ = fVar164 * fVar145;
  auVar26._0_4_ = fVar143 * fVar100;
  auVar26._8_4_ = fVar143 * fVar146;
  auVar26._12_4_ = fVar164 * fVar144;
  auVar26._16_4_ = fVar143 * 0.0;
  auVar26._20_4_ = fVar164 * 0.0;
  auVar26._24_4_ = fVar143 * 0.0;
  auVar26._28_4_ = uVar68;
  auVar76 = vfmadd231ps_fma(auVar26,auVar96,auVar320);
  auVar27._4_4_ = fVar166 * fVar145;
  auVar27._0_4_ = fVar166 * fVar100;
  auVar27._8_4_ = fVar166 * fVar146;
  auVar27._12_4_ = fVar166 * fVar144;
  auVar27._16_4_ = fVar166 * 0.0;
  auVar27._20_4_ = fVar166 * 0.0;
  auVar27._24_4_ = fVar166 * 0.0;
  auVar27._28_4_ = auVar306._4_4_;
  auVar157 = vfmadd231ps_fma(auVar27,auVar96,auVar303);
  fVar143 = auVar308._0_4_;
  fVar164 = auVar308._4_4_;
  auVar18._4_4_ = fVar164 * fVar145;
  auVar18._0_4_ = fVar143 * fVar100;
  auVar18._8_4_ = fVar143 * fVar146;
  auVar18._12_4_ = fVar164 * fVar144;
  auVar18._16_4_ = fVar143 * 0.0;
  auVar18._20_4_ = fVar164 * 0.0;
  auVar18._24_4_ = fVar143 * 0.0;
  auVar18._28_4_ = fVar220;
  auVar77 = vfmadd231ps_fma(auVar18,auVar96,auVar124);
  auVar306 = vshufps_avx(auVar298,auVar298,0xaa);
  uStack_550 = auVar306._0_8_;
  local_558 = (undefined1  [8])uStack_550;
  uStack_548 = uStack_550;
  uStack_540 = uStack_550;
  auVar307 = vshufps_avx(auVar298,auVar298,0xff);
  uStack_630 = auVar307._0_8_;
  local_638 = (undefined1  [8])uStack_630;
  uStack_628 = uStack_630;
  uStack_620 = uStack_630;
  auVar28._4_4_ = fVar165 * fVar145;
  auVar28._0_4_ = fVar165 * fVar100;
  auVar28._8_4_ = fVar165 * fVar146;
  auVar28._12_4_ = fVar165 * fVar144;
  auVar28._16_4_ = fVar165 * 0.0;
  auVar28._20_4_ = fVar165 * 0.0;
  auVar28._24_4_ = fVar165 * 0.0;
  auVar28._28_4_ = fVar165;
  auVar298 = vfmadd231ps_fma(auVar28,auVar96,auVar233);
  auVar307 = vshufps_avx(auVar73,auVar73,0xaa);
  auVar234._0_8_ = auVar307._0_8_;
  auVar234._8_8_ = auVar234._0_8_;
  auVar234._16_8_ = auVar234._0_8_;
  auVar234._24_8_ = auVar234._0_8_;
  auVar308 = vshufps_avx(auVar73,auVar73,0xff);
  local_508._8_8_ = auVar308._0_8_;
  local_508._0_8_ = local_508._8_8_;
  local_508._16_8_ = local_508._8_8_;
  local_508._24_8_ = local_508._8_8_;
  fVar143 = auVar19._0_4_;
  fVar164 = auVar19._4_4_;
  auVar29._4_4_ = fVar164 * fVar145;
  auVar29._0_4_ = fVar143 * fVar100;
  auVar29._8_4_ = fVar143 * fVar146;
  auVar29._12_4_ = fVar164 * fVar144;
  auVar29._16_4_ = fVar143 * 0.0;
  auVar29._20_4_ = fVar164 * 0.0;
  auVar29._24_4_ = fVar143 * 0.0;
  auVar29._28_4_ = auVar306._4_4_;
  auVar78 = vfmadd231ps_fma(auVar29,auVar96,auVar256);
  auVar30._28_4_ = fVar164;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar157._12_4_ * fVar144,
                          CONCAT48(auVar157._8_4_ * fVar146,
                                   CONCAT44(auVar157._4_4_ * fVar145,auVar157._0_4_ * fVar100))));
  auVar75 = vfmadd231ps_fma(auVar30,auVar96,ZEXT1632(auVar75));
  fVar143 = auVar308._4_4_;
  auVar31._28_4_ = fVar143;
  auVar31._0_28_ =
       ZEXT1628(CONCAT412(auVar77._12_4_ * fVar144,
                          CONCAT48(auVar77._8_4_ * fVar146,
                                   CONCAT44(auVar77._4_4_ * fVar145,auVar77._0_4_ * fVar100))));
  auVar76 = vfmadd231ps_fma(auVar31,auVar96,ZEXT1632(auVar76));
  auVar306 = vshufps_avx(auVar74,auVar74,0xaa);
  uVar101 = auVar306._0_8_;
  auVar217._8_8_ = uVar101;
  auVar217._0_8_ = uVar101;
  auVar217._16_8_ = uVar101;
  auVar217._24_8_ = uVar101;
  auVar19 = vshufps_avx(auVar74,auVar74,0xff);
  uVar101 = auVar19._0_8_;
  auVar336._8_8_ = uVar101;
  auVar336._0_8_ = uVar101;
  auVar336._16_8_ = uVar101;
  auVar336._24_8_ = uVar101;
  auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar298._12_4_ * fVar144,
                                               CONCAT48(auVar298._8_4_ * fVar146,
                                                        CONCAT44(auVar298._4_4_ * fVar145,
                                                                 auVar298._0_4_ * fVar100)))),
                            auVar96,ZEXT1632(auVar157));
  auVar298 = vshufps_avx(auVar291,auVar291,0xaa);
  auVar73 = vshufps_avx(auVar291,auVar291,0xff);
  auVar291 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar144 * auVar78._12_4_,
                                                CONCAT48(fVar146 * auVar78._8_4_,
                                                         CONCAT44(fVar145 * auVar78._4_4_,
                                                                  fVar100 * auVar78._0_4_)))),
                             auVar96,ZEXT1632(auVar77));
  auVar157 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar144 * auVar74._12_4_,
                                                CONCAT48(fVar146 * auVar74._8_4_,
                                                         CONCAT44(fVar145 * auVar74._4_4_,
                                                                  fVar100 * auVar74._0_4_)))),
                             auVar96,ZEXT1632(auVar75));
  auVar25 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar75));
  auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar144 * auVar291._12_4_,
                                               CONCAT48(fVar146 * auVar291._8_4_,
                                                        CONCAT44(fVar145 * auVar291._4_4_,
                                                                 fVar100 * auVar291._0_4_)))),
                            auVar96,ZEXT1632(auVar76));
  auVar26 = vsubps_avx(ZEXT1632(auVar291),ZEXT1632(auVar76));
  fStack_47c = auVar26._28_4_;
  auVar304._0_4_ = fStack_140 * auVar25._0_4_ * 3.0;
  auVar304._4_4_ = fStack_140 * auVar25._4_4_ * 3.0;
  auVar304._8_4_ = fStack_140 * auVar25._8_4_ * 3.0;
  auVar304._12_4_ = fStack_140 * auVar25._12_4_ * 3.0;
  auVar304._16_4_ = fStack_140 * auVar25._16_4_ * 3.0;
  auVar304._20_4_ = fStack_140 * auVar25._20_4_ * 3.0;
  auVar304._24_4_ = fStack_140 * auVar25._24_4_ * 3.0;
  auVar304._28_4_ = 0;
  local_498._0_4_ = fStack_140 * auVar26._0_4_ * 3.0;
  local_498._4_4_ = fStack_140 * auVar26._4_4_ * 3.0;
  fStack_490 = fStack_140 * auVar26._8_4_ * 3.0;
  fStack_48c = fStack_140 * auVar26._12_4_ * 3.0;
  fStack_488 = fStack_140 * auVar26._16_4_ * 3.0;
  fStack_484 = fStack_140 * auVar26._20_4_ * 3.0;
  fStack_480 = fStack_140 * auVar26._24_4_ * 3.0;
  fVar164 = auVar307._0_4_;
  fVar165 = auVar307._4_4_;
  auVar305._4_4_ = fVar165 * fVar145;
  auVar305._0_4_ = fVar164 * fVar100;
  auVar305._8_4_ = fVar164 * fVar146;
  auVar305._12_4_ = fVar165 * fVar144;
  auVar305._16_4_ = fVar164 * 0.0;
  auVar305._20_4_ = fVar165 * 0.0;
  auVar305._24_4_ = fVar164 * 0.0;
  auVar305._28_4_ = fStack_47c;
  auVar307 = vfmadd231ps_fma(auVar305,auVar96,_local_558);
  fVar164 = auVar308._0_4_;
  auVar33._4_4_ = fVar143 * fVar145;
  auVar33._0_4_ = fVar164 * fVar100;
  auVar33._8_4_ = fVar164 * fVar146;
  auVar33._12_4_ = fVar143 * fVar144;
  auVar33._16_4_ = fVar164 * 0.0;
  auVar33._20_4_ = fVar143 * 0.0;
  auVar33._24_4_ = fVar164 * 0.0;
  auVar33._28_4_ = 0;
  auVar308 = vfmadd231ps_fma(auVar33,auVar96,_local_638);
  fVar143 = auVar306._0_4_;
  fVar164 = auVar306._4_4_;
  auVar34._4_4_ = fVar164 * fVar145;
  auVar34._0_4_ = fVar143 * fVar100;
  auVar34._8_4_ = fVar143 * fVar146;
  auVar34._12_4_ = fVar164 * fVar144;
  auVar34._16_4_ = fVar143 * 0.0;
  auVar34._20_4_ = fVar164 * 0.0;
  auVar34._24_4_ = fVar143 * 0.0;
  auVar34._28_4_ = auVar25._28_4_;
  auVar306 = vfmadd231ps_fma(auVar34,auVar96,auVar234);
  fVar143 = auVar19._0_4_;
  fVar166 = auVar19._4_4_;
  auVar35._4_4_ = fVar166 * fVar145;
  auVar35._0_4_ = fVar143 * fVar100;
  auVar35._8_4_ = fVar143 * fVar146;
  auVar35._12_4_ = fVar166 * fVar144;
  auVar35._16_4_ = fVar143 * 0.0;
  auVar35._20_4_ = fVar166 * 0.0;
  auVar35._24_4_ = fVar143 * 0.0;
  auVar35._28_4_ = fVar165;
  auVar19 = vfmadd231ps_fma(auVar35,auVar96,local_508);
  auVar28 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar157));
  fVar143 = auVar298._0_4_;
  fVar164 = auVar298._4_4_;
  auVar36._4_4_ = fVar164 * fVar145;
  auVar36._0_4_ = fVar143 * fVar100;
  auVar36._8_4_ = fVar143 * fVar146;
  auVar36._12_4_ = fVar164 * fVar144;
  auVar36._16_4_ = fVar143 * 0.0;
  auVar36._20_4_ = fVar164 * 0.0;
  auVar36._24_4_ = fVar143 * 0.0;
  auVar36._28_4_ = fVar164;
  auVar298 = vfmadd231ps_fma(auVar36,auVar96,auVar217);
  auVar29 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar74));
  fVar143 = auVar73._0_4_;
  fVar164 = auVar73._4_4_;
  auVar37._4_4_ = fVar164 * fVar145;
  auVar37._0_4_ = fVar143 * fVar100;
  auVar37._8_4_ = fVar143 * fVar146;
  auVar37._12_4_ = fVar164 * fVar144;
  auVar37._16_4_ = fVar143 * 0.0;
  auVar37._20_4_ = fVar164 * 0.0;
  auVar37._24_4_ = fVar143 * 0.0;
  auVar37._28_4_ = fVar164;
  auVar73 = vfmadd231ps_fma(auVar37,auVar96,auVar336);
  auVar38._28_4_ = fVar166;
  auVar38._0_28_ =
       ZEXT1628(CONCAT412(auVar306._12_4_ * fVar144,
                          CONCAT48(auVar306._8_4_ * fVar146,
                                   CONCAT44(auVar306._4_4_ * fVar145,auVar306._0_4_ * fVar100))));
  auVar307 = vfmadd231ps_fma(auVar38,auVar96,ZEXT1632(auVar307));
  auVar308 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar144 * auVar19._12_4_,
                                                CONCAT48(fVar146 * auVar19._8_4_,
                                                         CONCAT44(fVar145 * auVar19._4_4_,
                                                                  fVar100 * auVar19._0_4_)))),
                             auVar96,ZEXT1632(auVar308));
  auVar125._0_4_ = auVar157._0_4_ + auVar304._0_4_;
  auVar125._4_4_ = auVar157._4_4_ + auVar304._4_4_;
  auVar125._8_4_ = auVar157._8_4_ + auVar304._8_4_;
  auVar125._12_4_ = auVar157._12_4_ + auVar304._12_4_;
  auVar125._16_4_ = auVar304._16_4_ + 0.0;
  auVar125._20_4_ = auVar304._20_4_ + 0.0;
  auVar125._24_4_ = auVar304._24_4_ + 0.0;
  auVar125._28_4_ = 0;
  auVar306 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar298._12_4_ * fVar144,
                                                CONCAT48(auVar298._8_4_ * fVar146,
                                                         CONCAT44(auVar298._4_4_ * fVar145,
                                                                  auVar298._0_4_ * fVar100)))),
                             auVar96,ZEXT1632(auVar306));
  auVar19 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar73._12_4_ * fVar144,
                                               CONCAT48(auVar73._8_4_ * fVar146,
                                                        CONCAT44(auVar73._4_4_ * fVar145,
                                                                 auVar73._0_4_ * fVar100)))),auVar96
                            ,ZEXT1632(auVar19));
  auVar298 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar144 * auVar306._12_4_,
                                                CONCAT48(fVar146 * auVar306._8_4_,
                                                         CONCAT44(fVar145 * auVar306._4_4_,
                                                                  fVar100 * auVar306._0_4_)))),
                             auVar96,ZEXT1632(auVar307));
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar19._12_4_ * fVar144,
                                               CONCAT48(auVar19._8_4_ * fVar146,
                                                        CONCAT44(auVar19._4_4_ * fVar145,
                                                                 auVar19._0_4_ * fVar100)))),
                            ZEXT1632(auVar308),auVar96);
  auVar96 = vsubps_avx(ZEXT1632(auVar306),ZEXT1632(auVar307));
  auVar25 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar308));
  auVar328._0_4_ = fStack_140 * auVar96._0_4_ * 3.0;
  auVar328._4_4_ = fStack_140 * auVar96._4_4_ * 3.0;
  auVar328._8_4_ = fStack_140 * auVar96._8_4_ * 3.0;
  auVar328._12_4_ = fStack_140 * auVar96._12_4_ * 3.0;
  auVar328._16_4_ = fStack_140 * auVar96._16_4_ * 3.0;
  auVar328._20_4_ = fStack_140 * auVar96._20_4_ * 3.0;
  auVar328._24_4_ = fStack_140 * auVar96._24_4_ * 3.0;
  auVar328._28_4_ = 0;
  local_158 = fStack_140 * auVar25._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar25._4_4_ * 3.0;
  auVar39._4_4_ = fStack_154;
  auVar39._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar25._8_4_ * 3.0;
  auVar39._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar25._12_4_ * 3.0;
  auVar39._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar25._16_4_ * 3.0;
  auVar39._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar25._20_4_ * 3.0;
  auVar39._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar25._24_4_ * 3.0;
  auVar39._24_4_ = fStack_140;
  auVar39._28_4_ = 0x40400000;
  auVar30 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar298));
  _local_458 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar73));
  auVar96 = vsubps_avx(ZEXT1632(auVar298),ZEXT1632(auVar157));
  auVar25 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar74));
  auVar26 = vsubps_avx(auVar30,auVar28);
  fVar220 = auVar96._0_4_ + auVar26._0_4_;
  fVar237 = auVar96._4_4_ + auVar26._4_4_;
  fVar238 = auVar96._8_4_ + auVar26._8_4_;
  fVar239 = auVar96._12_4_ + auVar26._12_4_;
  fVar240 = auVar96._16_4_ + auVar26._16_4_;
  fVar241 = auVar96._20_4_ + auVar26._20_4_;
  fVar242 = auVar96._24_4_ + auVar26._24_4_;
  auVar27 = vsubps_avx(_local_458,auVar29);
  auVar97._0_4_ = auVar25._0_4_ + auVar27._0_4_;
  auVar97._4_4_ = auVar25._4_4_ + auVar27._4_4_;
  auVar97._8_4_ = auVar25._8_4_ + auVar27._8_4_;
  auVar97._12_4_ = auVar25._12_4_ + auVar27._12_4_;
  auVar97._16_4_ = auVar25._16_4_ + auVar27._16_4_;
  auVar97._20_4_ = auVar25._20_4_ + auVar27._20_4_;
  auVar97._24_4_ = auVar25._24_4_ + auVar27._24_4_;
  auVar97._28_4_ = auVar25._28_4_ + auVar27._28_4_;
  local_f8 = ZEXT1632(auVar74);
  fVar100 = auVar74._0_4_;
  local_178 = (float)local_498._0_4_ + fVar100;
  fVar145 = auVar74._4_4_;
  fStack_174 = (float)local_498._4_4_ + fVar145;
  fVar146 = auVar74._8_4_;
  fStack_170 = fStack_490 + fVar146;
  fVar144 = auVar74._12_4_;
  fStack_16c = fStack_48c + fVar144;
  fStack_168 = fStack_488 + 0.0;
  fStack_164 = fStack_484 + 0.0;
  fStack_160 = fStack_480 + 0.0;
  local_b8 = ZEXT1632(auVar157);
  auVar25 = vsubps_avx(local_b8,auVar304);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar25 = vsubps_avx(local_f8,_local_498);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar25);
  local_118._0_4_ = auVar298._0_4_ + auVar328._0_4_;
  local_118._4_4_ = auVar298._4_4_ + auVar328._4_4_;
  local_118._8_4_ = auVar298._8_4_ + auVar328._8_4_;
  local_118._12_4_ = auVar298._12_4_ + auVar328._12_4_;
  local_118._16_4_ = auVar328._16_4_ + 0.0;
  local_118._20_4_ = auVar328._20_4_ + 0.0;
  local_118._24_4_ = auVar328._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar305 = ZEXT1632(auVar298);
  auVar25 = vsubps_avx(auVar305,auVar328);
  auVar31 = vpermps_avx2(_DAT_01fb7720,auVar25);
  fVar143 = auVar73._0_4_;
  local_158 = fVar143 + local_158;
  fVar164 = auVar73._4_4_;
  fStack_154 = fVar164 + fStack_154;
  fVar165 = auVar73._8_4_;
  fStack_150 = fVar165 + fStack_150;
  fVar166 = auVar73._12_4_;
  fStack_14c = fVar166 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar25 = vsubps_avx(ZEXT1632(auVar73),auVar39);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar40._4_4_ = fVar145 * fVar237;
  auVar40._0_4_ = fVar100 * fVar220;
  auVar40._8_4_ = fVar146 * fVar238;
  auVar40._12_4_ = fVar144 * fVar239;
  auVar40._16_4_ = fVar240 * 0.0;
  auVar40._20_4_ = fVar241 * 0.0;
  auVar40._24_4_ = fVar242 * 0.0;
  auVar40._28_4_ = auVar25._28_4_;
  auVar306 = vfnmadd231ps_fma(auVar40,local_b8,auVar97);
  fStack_15c = fStack_47c + 0.0;
  auVar41._4_4_ = fStack_174 * fVar237;
  auVar41._0_4_ = local_178 * fVar220;
  auVar41._8_4_ = fStack_170 * fVar238;
  auVar41._12_4_ = fStack_16c * fVar239;
  auVar41._16_4_ = fStack_168 * fVar240;
  auVar41._20_4_ = fStack_164 * fVar241;
  auVar41._24_4_ = fStack_160 * fVar242;
  auVar41._28_4_ = 0;
  auVar307 = vfnmadd231ps_fma(auVar41,auVar97,auVar125);
  auVar42._4_4_ = local_198._4_4_ * fVar237;
  auVar42._0_4_ = local_198._0_4_ * fVar220;
  auVar42._8_4_ = local_198._8_4_ * fVar238;
  auVar42._12_4_ = local_198._12_4_ * fVar239;
  auVar42._16_4_ = local_198._16_4_ * fVar240;
  auVar42._20_4_ = local_198._20_4_ * fVar241;
  auVar42._24_4_ = local_198._24_4_ * fVar242;
  auVar42._28_4_ = fStack_47c + 0.0;
  auVar308 = vfnmadd231ps_fma(auVar42,local_d8,auVar97);
  local_638._0_4_ = auVar29._0_4_;
  local_638._4_4_ = auVar29._4_4_;
  uStack_630._0_4_ = auVar29._8_4_;
  uStack_630._4_4_ = auVar29._12_4_;
  uStack_628._0_4_ = auVar29._16_4_;
  uStack_628._4_4_ = auVar29._20_4_;
  uStack_620._0_4_ = auVar29._24_4_;
  uStack_620._4_4_ = auVar29._28_4_;
  auVar43._4_4_ = (float)local_638._4_4_ * fVar237;
  auVar43._0_4_ = (float)local_638._0_4_ * fVar220;
  auVar43._8_4_ = (float)uStack_630 * fVar238;
  auVar43._12_4_ = uStack_630._4_4_ * fVar239;
  auVar43._16_4_ = (float)uStack_628 * fVar240;
  auVar43._20_4_ = uStack_628._4_4_ * fVar241;
  auVar43._24_4_ = (float)uStack_620 * fVar242;
  auVar43._28_4_ = uStack_620._4_4_;
  auVar19 = vfnmadd231ps_fma(auVar43,auVar28,auVar97);
  auVar257._0_4_ = fVar143 * fVar220;
  auVar257._4_4_ = fVar164 * fVar237;
  auVar257._8_4_ = fVar165 * fVar238;
  auVar257._12_4_ = fVar166 * fVar239;
  auVar257._16_4_ = fVar240 * 0.0;
  auVar257._20_4_ = fVar241 * 0.0;
  auVar257._24_4_ = fVar242 * 0.0;
  auVar257._28_4_ = 0;
  auVar298 = vfnmadd231ps_fma(auVar257,auVar305,auVar97);
  uStack_13c = 0x40400000;
  auVar44._4_4_ = fStack_154 * fVar237;
  auVar44._0_4_ = local_158 * fVar220;
  auVar44._8_4_ = fStack_150 * fVar238;
  auVar44._12_4_ = fStack_14c * fVar239;
  auVar44._16_4_ = fStack_148 * fVar240;
  auVar44._20_4_ = fStack_144 * fVar241;
  auVar44._24_4_ = fStack_140 * fVar242;
  auVar44._28_4_ = auVar28._28_4_;
  auVar74 = vfnmadd231ps_fma(auVar44,local_118,auVar97);
  auVar45._4_4_ = local_138._4_4_ * fVar237;
  auVar45._0_4_ = local_138._0_4_ * fVar220;
  auVar45._8_4_ = local_138._8_4_ * fVar238;
  auVar45._12_4_ = local_138._12_4_ * fVar239;
  auVar45._16_4_ = local_138._16_4_ * fVar240;
  auVar45._20_4_ = local_138._20_4_ * fVar241;
  auVar45._24_4_ = local_138._24_4_ * fVar242;
  auVar45._28_4_ = local_138._28_4_;
  auVar291 = vfnmadd231ps_fma(auVar45,auVar31,auVar97);
  auVar46._4_4_ = local_458._4_4_ * fVar237;
  auVar46._0_4_ = local_458._0_4_ * fVar220;
  auVar46._8_4_ = local_458._8_4_ * fVar238;
  auVar46._12_4_ = local_458._12_4_ * fVar239;
  auVar46._16_4_ = local_458._16_4_ * fVar240;
  auVar46._20_4_ = local_458._20_4_ * fVar241;
  auVar46._24_4_ = local_458._24_4_ * fVar242;
  auVar46._28_4_ = auVar96._28_4_ + auVar26._28_4_;
  auVar75 = vfnmadd231ps_fma(auVar46,auVar30,auVar97);
  auVar25 = vminps_avx(ZEXT1632(auVar306),ZEXT1632(auVar307));
  auVar96 = vmaxps_avx(ZEXT1632(auVar306),ZEXT1632(auVar307));
  auVar26 = vminps_avx(ZEXT1632(auVar308),ZEXT1632(auVar19));
  auVar26 = vminps_avx(auVar25,auVar26);
  auVar25 = vmaxps_avx(ZEXT1632(auVar308),ZEXT1632(auVar19));
  auVar96 = vmaxps_avx(auVar96,auVar25);
  auVar27 = vminps_avx(ZEXT1632(auVar298),ZEXT1632(auVar74));
  auVar25 = vmaxps_avx(ZEXT1632(auVar298),ZEXT1632(auVar74));
  auVar18 = vminps_avx(ZEXT1632(auVar291),ZEXT1632(auVar75));
  auVar27 = vminps_avx(auVar27,auVar18);
  auVar27 = vminps_avx(auVar26,auVar27);
  auVar26 = vmaxps_avx(ZEXT1632(auVar291),ZEXT1632(auVar75));
  auVar25 = vmaxps_avx(auVar25,auVar26);
  auVar25 = vmaxps_avx(auVar96,auVar25);
  auVar55._4_4_ = fStack_74;
  auVar55._0_4_ = local_78;
  auVar55._8_4_ = fStack_70;
  auVar55._12_4_ = fStack_6c;
  auVar55._16_4_ = fStack_68;
  auVar55._20_4_ = fStack_64;
  auVar55._24_4_ = fStack_60;
  auVar55._28_4_ = fStack_5c;
  auVar96 = vcmpps_avx(auVar27,auVar55,2);
  auVar54._4_4_ = fStack_94;
  auVar54._0_4_ = local_98;
  auVar54._8_4_ = fStack_90;
  auVar54._12_4_ = fStack_8c;
  auVar54._16_4_ = fStack_88;
  auVar54._20_4_ = fStack_84;
  auVar54._24_4_ = fStack_80;
  auVar54._28_4_ = fStack_7c;
  auVar25 = vcmpps_avx(auVar25,auVar54,5);
  auVar96 = vandps_avx(auVar25,auVar96);
  auVar25 = local_1b8 & auVar96;
  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0x7f,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar25 >> 0xbf,0) != '\0') ||
      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0') {
    auVar25 = vsubps_avx(auVar28,local_b8);
    auVar26 = vsubps_avx(auVar30,auVar305);
    fVar237 = auVar25._0_4_ + auVar26._0_4_;
    fVar238 = auVar25._4_4_ + auVar26._4_4_;
    fVar239 = auVar25._8_4_ + auVar26._8_4_;
    fVar240 = auVar25._12_4_ + auVar26._12_4_;
    fVar241 = auVar25._16_4_ + auVar26._16_4_;
    fVar242 = auVar25._20_4_ + auVar26._20_4_;
    fVar99 = auVar25._24_4_ + auVar26._24_4_;
    auVar27 = vsubps_avx(auVar29,local_f8);
    auVar18 = vsubps_avx(_local_458,ZEXT1632(auVar73));
    auVar126._0_4_ = auVar27._0_4_ + auVar18._0_4_;
    auVar126._4_4_ = auVar27._4_4_ + auVar18._4_4_;
    auVar126._8_4_ = auVar27._8_4_ + auVar18._8_4_;
    auVar126._12_4_ = auVar27._12_4_ + auVar18._12_4_;
    auVar126._16_4_ = auVar27._16_4_ + auVar18._16_4_;
    auVar126._20_4_ = auVar27._20_4_ + auVar18._20_4_;
    auVar126._24_4_ = auVar27._24_4_ + auVar18._24_4_;
    fVar220 = auVar18._28_4_;
    auVar126._28_4_ = auVar27._28_4_ + fVar220;
    auVar47._4_4_ = fVar145 * fVar238;
    auVar47._0_4_ = fVar100 * fVar237;
    auVar47._8_4_ = fVar146 * fVar239;
    auVar47._12_4_ = fVar144 * fVar240;
    auVar47._16_4_ = fVar241 * 0.0;
    auVar47._20_4_ = fVar242 * 0.0;
    auVar47._24_4_ = fVar99 * 0.0;
    auVar47._28_4_ = local_458._28_4_;
    auVar298 = vfnmadd231ps_fma(auVar47,auVar126,local_b8);
    auVar48._4_4_ = fVar238 * fStack_174;
    auVar48._0_4_ = fVar237 * local_178;
    auVar48._8_4_ = fVar239 * fStack_170;
    auVar48._12_4_ = fVar240 * fStack_16c;
    auVar48._16_4_ = fVar241 * fStack_168;
    auVar48._20_4_ = fVar242 * fStack_164;
    auVar48._24_4_ = fVar99 * fStack_160;
    auVar48._28_4_ = 0;
    auVar306 = vfnmadd213ps_fma(auVar125,auVar126,auVar48);
    auVar49._4_4_ = fVar238 * local_198._4_4_;
    auVar49._0_4_ = fVar237 * local_198._0_4_;
    auVar49._8_4_ = fVar239 * local_198._8_4_;
    auVar49._12_4_ = fVar240 * local_198._12_4_;
    auVar49._16_4_ = fVar241 * local_198._16_4_;
    auVar49._20_4_ = fVar242 * local_198._20_4_;
    auVar49._24_4_ = fVar99 * local_198._24_4_;
    auVar49._28_4_ = 0;
    auVar307 = vfnmadd213ps_fma(local_d8,auVar126,auVar49);
    auVar50._4_4_ = (float)local_638._4_4_ * fVar238;
    auVar50._0_4_ = (float)local_638._0_4_ * fVar237;
    auVar50._8_4_ = (float)uStack_630 * fVar239;
    auVar50._12_4_ = uStack_630._4_4_ * fVar240;
    auVar50._16_4_ = (float)uStack_628 * fVar241;
    auVar50._20_4_ = uStack_628._4_4_ * fVar242;
    auVar50._24_4_ = (float)uStack_620 * fVar99;
    auVar50._28_4_ = 0;
    auVar73 = vfnmadd231ps_fma(auVar50,auVar126,auVar28);
    auVar162._0_4_ = fVar143 * fVar237;
    auVar162._4_4_ = fVar164 * fVar238;
    auVar162._8_4_ = fVar165 * fVar239;
    auVar162._12_4_ = fVar166 * fVar240;
    auVar162._16_4_ = fVar241 * 0.0;
    auVar162._20_4_ = fVar242 * 0.0;
    auVar162._24_4_ = fVar99 * 0.0;
    auVar162._28_4_ = 0;
    auVar74 = vfnmadd231ps_fma(auVar162,auVar126,auVar305);
    auVar51._4_4_ = fVar238 * fStack_154;
    auVar51._0_4_ = fVar237 * local_158;
    auVar51._8_4_ = fVar239 * fStack_150;
    auVar51._12_4_ = fVar240 * fStack_14c;
    auVar51._16_4_ = fVar241 * fStack_148;
    auVar51._20_4_ = fVar242 * fStack_144;
    auVar51._24_4_ = fVar99 * fStack_140;
    auVar51._28_4_ = fVar220;
    auVar308 = vfnmadd213ps_fma(local_118,auVar126,auVar51);
    auVar52._4_4_ = fVar238 * local_138._4_4_;
    auVar52._0_4_ = fVar237 * local_138._0_4_;
    auVar52._8_4_ = fVar239 * local_138._8_4_;
    auVar52._12_4_ = fVar240 * local_138._12_4_;
    auVar52._16_4_ = fVar241 * local_138._16_4_;
    auVar52._20_4_ = fVar242 * local_138._20_4_;
    auVar52._24_4_ = fVar99 * local_138._24_4_;
    auVar52._28_4_ = fVar220;
    auVar19 = vfnmadd213ps_fma(auVar31,auVar126,auVar52);
    auVar53._4_4_ = fVar238 * local_458._4_4_;
    auVar53._0_4_ = fVar237 * local_458._0_4_;
    auVar53._8_4_ = fVar239 * local_458._8_4_;
    auVar53._12_4_ = fVar240 * local_458._12_4_;
    auVar53._16_4_ = fVar241 * local_458._16_4_;
    auVar53._20_4_ = fVar242 * local_458._20_4_;
    auVar53._24_4_ = fVar99 * local_458._24_4_;
    auVar53._28_4_ = auVar25._28_4_ + auVar26._28_4_;
    auVar291 = vfnmadd231ps_fma(auVar53,auVar126,auVar30);
    auVar26 = vminps_avx(ZEXT1632(auVar298),ZEXT1632(auVar306));
    auVar25 = vmaxps_avx(ZEXT1632(auVar298),ZEXT1632(auVar306));
    auVar27 = vminps_avx(ZEXT1632(auVar307),ZEXT1632(auVar73));
    auVar27 = vminps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(ZEXT1632(auVar307),ZEXT1632(auVar73));
    auVar25 = vmaxps_avx(auVar25,auVar26);
    auVar18 = vminps_avx(ZEXT1632(auVar74),ZEXT1632(auVar308));
    auVar26 = vmaxps_avx(ZEXT1632(auVar74),ZEXT1632(auVar308));
    auVar28 = vminps_avx(ZEXT1632(auVar19),ZEXT1632(auVar291));
    auVar18 = vminps_avx(auVar18,auVar28);
    auVar18 = vminps_avx(auVar27,auVar18);
    auVar27 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar291));
    auVar26 = vmaxps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar25,auVar26);
    auVar25 = vcmpps_avx(auVar18,auVar55,2);
    auVar26 = vcmpps_avx(auVar26,auVar54,5);
    auVar25 = vandps_avx(auVar26,auVar25);
    auVar96 = vandps_avx(auVar96,local_1b8);
    auVar26 = auVar96 & auVar25;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar96 = vandps_avx(auVar25,auVar96);
      uVar62 = vmovmskps_avx(auVar96);
      if (uVar62 != 0) {
        mask_stack[uVar60] = uVar62 & 0xff;
        BVar5 = (BBox1f)vmovlps_avx(auVar122);
        cu_stack[uVar60] = BVar5;
        BVar5 = (BBox1f)vmovlps_avx(auVar82);
        cv_stack[uVar60] = BVar5;
        uVar60 = (ulong)((int)uVar60 + 1);
      }
    }
  }
LAB_01294626:
  if ((int)uVar60 == 0) {
    uVar68 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar95._4_4_ = uVar68;
    auVar95._0_4_ = uVar68;
    auVar95._8_4_ = uVar68;
    auVar95._12_4_ = uVar68;
    auVar122 = vcmpps_avx(auVar200,auVar95,2);
    uVar59 = vmovmskps_avx(auVar122);
    uVar66 = uVar66 & uVar66 + 0xf & uVar59;
    goto LAB_012933de;
  }
  uVar58 = (int)uVar60 - 1;
  uVar62 = mask_stack[uVar58];
  fVar100 = cu_stack[uVar58].lower;
  fVar145 = cu_stack[uVar58].upper;
  iVar32 = 0;
  for (uVar64 = (ulong)uVar62; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    iVar32 = iVar32 + 1;
  }
  uVar62 = uVar62 - 1 & uVar62;
  if (uVar62 == 0) {
    uVar60 = (ulong)uVar58;
  }
  auVar82._8_8_ = 0;
  auVar82._0_4_ = cv_stack[uVar58].lower;
  auVar82._4_4_ = cv_stack[uVar58].upper;
  mask_stack[uVar58] = uVar62;
  fVar146 = (float)(iVar32 + 1) * 0.14285715;
  auVar122 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * (float)iVar32 * 0.14285715)),
                             ZEXT416((uint)fVar100),
                             ZEXT416((uint)(1.0 - (float)iVar32 * 0.14285715)));
  auVar306 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar146)),ZEXT416((uint)fVar100),
                             ZEXT416((uint)(1.0 - fVar146)));
  fVar145 = auVar306._0_4_;
  auVar235._0_4_ = auVar122._0_4_;
  fVar100 = fVar145 - auVar235._0_4_;
  if (fVar100 < 0.16666667) {
    auVar307 = vshufps_avx(auVar82,auVar82,0x50);
    auVar113._8_4_ = 0x3f800000;
    auVar113._0_8_ = 0x3f8000003f800000;
    auVar113._12_4_ = 0x3f800000;
    auVar308 = vsubps_avx(auVar113,auVar307);
    fVar146 = auVar307._0_4_;
    auVar175._0_4_ = fVar146 * fVar243;
    fVar144 = auVar307._4_4_;
    auVar175._4_4_ = fVar144 * fVar258;
    fVar143 = auVar307._8_4_;
    auVar175._8_4_ = fVar143 * fVar243;
    fVar164 = auVar307._12_4_;
    auVar175._12_4_ = fVar164 * fVar258;
    auVar189._0_4_ = fVar146 * fVar198;
    auVar189._4_4_ = fVar144 * fVar218;
    auVar189._8_4_ = fVar143 * fVar198;
    auVar189._12_4_ = fVar164 * fVar218;
    auVar214._0_4_ = fVar146 * fVar219;
    auVar214._4_4_ = fVar144 * fVar236;
    auVar214._8_4_ = fVar143 * fVar219;
    auVar214._12_4_ = fVar164 * fVar236;
    auVar84._0_4_ = fVar146 * fVar259;
    auVar84._4_4_ = fVar144 * fVar260;
    auVar84._8_4_ = fVar143 * fVar259;
    auVar84._12_4_ = fVar164 * fVar260;
    auVar307 = vfmadd231ps_fma(auVar175,auVar308,auVar252);
    auVar19 = vfmadd231ps_fma(auVar189,auVar308,auVar278);
    auVar298 = vfmadd231ps_fma(auVar214,auVar308,auVar312);
    auVar308 = vfmadd231ps_fma(auVar84,auVar308,auVar323);
    auVar163._16_16_ = auVar307;
    auVar163._0_16_ = auVar307;
    auVar180._16_16_ = auVar19;
    auVar180._0_16_ = auVar19;
    auVar197._16_16_ = auVar298;
    auVar197._0_16_ = auVar298;
    auVar235._4_4_ = auVar235._0_4_;
    auVar235._8_4_ = auVar235._0_4_;
    auVar235._12_4_ = auVar235._0_4_;
    auVar235._20_4_ = fVar145;
    auVar235._16_4_ = fVar145;
    auVar235._24_4_ = fVar145;
    auVar235._28_4_ = fVar145;
    auVar96 = vsubps_avx(auVar180,auVar163);
    auVar19 = vfmadd213ps_fma(auVar96,auVar235,auVar163);
    auVar96 = vsubps_avx(auVar197,auVar180);
    auVar73 = vfmadd213ps_fma(auVar96,auVar235,auVar180);
    auVar307 = vsubps_avx(auVar308,auVar298);
    auVar98._16_16_ = auVar307;
    auVar98._0_16_ = auVar307;
    auVar307 = vfmadd213ps_fma(auVar98,auVar235,auVar197);
    auVar96 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar19));
    auVar308 = vfmadd213ps_fma(auVar96,auVar235,ZEXT1632(auVar19));
    auVar96 = vsubps_avx(ZEXT1632(auVar307),ZEXT1632(auVar73));
    auVar307 = vfmadd213ps_fma(auVar96,auVar235,ZEXT1632(auVar73));
    auVar96 = vsubps_avx(ZEXT1632(auVar307),ZEXT1632(auVar308));
    auVar75 = vfmadd231ps_fma(ZEXT1632(auVar308),auVar96,auVar235);
    fVar146 = fVar100 * 0.33333334;
    auVar228._0_8_ =
         CONCAT44(auVar75._4_4_ + fVar146 * auVar96._4_4_ * 3.0,
                  auVar75._0_4_ + fVar146 * auVar96._0_4_ * 3.0);
    auVar228._8_4_ = auVar75._8_4_ + fVar146 * auVar96._8_4_ * 3.0;
    auVar228._12_4_ = auVar75._12_4_ + fVar146 * auVar96._12_4_ * 3.0;
    auVar308 = vshufpd_avx(auVar75,auVar75,3);
    auVar19 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    _local_458 = auVar308;
    auVar307 = vsubps_avx(auVar308,auVar75);
    auVar298 = vsubps_avx(auVar19,(undefined1  [16])0x0);
    auVar85._0_4_ = auVar307._0_4_ + auVar298._0_4_;
    auVar85._4_4_ = auVar307._4_4_ + auVar298._4_4_;
    auVar85._8_4_ = auVar307._8_4_ + auVar298._8_4_;
    auVar85._12_4_ = auVar307._12_4_ + auVar298._12_4_;
    auVar307 = vshufps_avx(auVar75,auVar75,0xb1);
    auVar298 = vshufps_avx(auVar228,auVar228,0xb1);
    auVar324._4_4_ = auVar85._0_4_;
    auVar324._0_4_ = auVar85._0_4_;
    auVar324._8_4_ = auVar85._0_4_;
    auVar324._12_4_ = auVar85._0_4_;
    auVar73 = vshufps_avx(auVar85,auVar85,0x55);
    fVar144 = auVar73._0_4_;
    auVar86._0_4_ = fVar144 * auVar307._0_4_;
    fVar143 = auVar73._4_4_;
    auVar86._4_4_ = fVar143 * auVar307._4_4_;
    fVar164 = auVar73._8_4_;
    auVar86._8_4_ = fVar164 * auVar307._8_4_;
    fVar165 = auVar73._12_4_;
    auVar86._12_4_ = fVar165 * auVar307._12_4_;
    auVar190._0_4_ = fVar144 * auVar298._0_4_;
    auVar190._4_4_ = fVar143 * auVar298._4_4_;
    auVar190._8_4_ = fVar164 * auVar298._8_4_;
    auVar190._12_4_ = fVar165 * auVar298._12_4_;
    auVar74 = vfmadd231ps_fma(auVar86,auVar324,auVar75);
    auVar291 = vfmadd231ps_fma(auVar190,auVar324,auVar228);
    auVar298 = vshufps_avx(auVar74,auVar74,0xe8);
    auVar73 = vshufps_avx(auVar291,auVar291,0xe8);
    auVar307 = vcmpps_avx(auVar298,auVar73,1);
    uVar62 = vextractps_avx(auVar307,0);
    auVar76 = auVar291;
    if ((uVar62 & 1) == 0) {
      auVar76 = auVar74;
    }
    auVar156._0_4_ = fVar146 * auVar96._16_4_ * 3.0;
    auVar156._4_4_ = fVar146 * auVar96._20_4_ * 3.0;
    auVar156._8_4_ = fVar146 * auVar96._24_4_ * 3.0;
    auVar156._12_4_ = fVar146 * 0.0;
    auVar79 = vsubps_avx((undefined1  [16])0x0,auVar156);
    auVar157 = vshufps_avx(auVar79,auVar79,0xb1);
    auVar77 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar229._0_4_ = fVar144 * auVar157._0_4_;
    auVar229._4_4_ = fVar143 * auVar157._4_4_;
    auVar229._8_4_ = fVar164 * auVar157._8_4_;
    auVar229._12_4_ = fVar165 * auVar157._12_4_;
    auVar253._0_4_ = auVar77._0_4_ * fVar144;
    auVar253._4_4_ = auVar77._4_4_ * fVar143;
    auVar253._8_4_ = auVar77._8_4_ * fVar164;
    auVar253._12_4_ = auVar77._12_4_ * fVar165;
    auVar80 = vfmadd231ps_fma(auVar229,auVar324,auVar79);
    auVar81 = vfmadd231ps_fma(auVar253,(undefined1  [16])0x0,auVar324);
    auVar77 = vshufps_avx(auVar80,auVar80,0xe8);
    auVar78 = vshufps_avx(auVar81,auVar81,0xe8);
    auVar157 = vcmpps_avx(auVar77,auVar78,1);
    uVar62 = vextractps_avx(auVar157,0);
    auVar104 = auVar81;
    if ((uVar62 & 1) == 0) {
      auVar104 = auVar80;
    }
    auVar76 = vmaxss_avx(auVar104,auVar76);
    auVar298 = vminps_avx(auVar298,auVar73);
    auVar73 = vminps_avx(auVar77,auVar78);
    auVar73 = vminps_avx(auVar298,auVar73);
    auVar307 = vshufps_avx(auVar307,auVar307,0x55);
    auVar307 = vblendps_avx(auVar307,auVar157,2);
    auVar157 = vpslld_avx(auVar307,0x1f);
    auVar307 = vshufpd_avx(auVar291,auVar291,1);
    auVar307 = vinsertps_avx(auVar307,auVar81,0x9c);
    auVar298 = vshufpd_avx(auVar74,auVar74,1);
    auVar298 = vinsertps_avx(auVar298,auVar80,0x9c);
    auVar307 = vblendvps_avx(auVar298,auVar307,auVar157);
    auVar298 = vmovshdup_avx(auVar307);
    auVar307 = vmaxss_avx(auVar298,auVar307);
    fVar164 = auVar73._0_4_;
    auVar298 = vmovshdup_avx(auVar73);
    fVar143 = auVar307._0_4_;
    fVar146 = auVar298._0_4_;
    fVar144 = auVar76._0_4_;
    if (((0.0001 <= fVar164) || (fVar143 <= -0.0001)) && (0.0001 <= fVar146 || fVar143 <= -0.0001))
    goto code_r0x01294934;
    goto LAB_0129495a;
  }
  auVar122 = vinsertps_avx(auVar122,auVar306,0x10);
  goto LAB_01294075;
code_r0x01294934:
  auVar298 = vcmpps_avx(auVar298,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar74 = vcmpps_avx(auVar73,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar298 = vandps_avx(auVar74,auVar298);
  if (fVar144 <= -0.0001 || (auVar298 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01294626;
LAB_0129495a:
  auVar74 = vcmpps_avx(auVar73,_DAT_01f45a50,1);
  auVar291 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar298 = vcmpss_avx(auVar76,ZEXT816(0) << 0x20,1);
  auVar114._8_4_ = 0x3f800000;
  auVar114._0_8_ = 0x3f8000003f800000;
  auVar114._12_4_ = 0x3f800000;
  auVar137._8_4_ = 0xbf800000;
  auVar137._0_8_ = 0xbf800000bf800000;
  auVar137._12_4_ = 0xbf800000;
  auVar298 = vblendvps_avx(auVar114,auVar137,auVar298);
  auVar74 = vblendvps_avx(auVar114,auVar137,auVar74);
  fVar166 = auVar74._0_4_;
  fVar165 = auVar298._0_4_;
  auVar298 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar166 == fVar165) && (!NAN(fVar166) && !NAN(fVar165))) {
    auVar298 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar166 == fVar165) && (!NAN(fVar166) && !NAN(fVar165))) {
    auVar291 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar74 = vmovshdup_avx(auVar74);
  fVar220 = auVar74._0_4_;
  if ((fVar166 != fVar220) || (NAN(fVar166) || NAN(fVar220))) {
    if ((fVar146 != fVar164) || (NAN(fVar146) || NAN(fVar164))) {
      auVar158._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
      auVar158._8_4_ = auVar73._8_4_ ^ 0x80000000;
      auVar158._12_4_ = auVar73._12_4_ ^ 0x80000000;
      auVar159._0_4_ = -fVar164 / (fVar146 - fVar164);
      auVar159._4_12_ = auVar158._4_12_;
      auVar73 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar159._0_4_)),auVar159,ZEXT416(0));
      auVar74 = auVar73;
    }
    else {
      auVar73 = ZEXT816(0) << 0x20;
      if ((fVar164 != 0.0) || (auVar74 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar164))) {
        auVar73 = SUB6416(ZEXT464(0x7f800000),0);
        auVar74 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar298 = vminss_avx(auVar298,auVar73);
    auVar291 = vmaxss_avx(auVar74,auVar291);
  }
  auVar307 = vcmpss_avx(auVar307,ZEXT416(0),1);
  auVar115._8_4_ = 0x3f800000;
  auVar115._0_8_ = 0x3f8000003f800000;
  auVar115._12_4_ = 0x3f800000;
  auVar138._8_4_ = 0xbf800000;
  auVar138._0_8_ = 0xbf800000bf800000;
  auVar138._12_4_ = 0xbf800000;
  auVar307 = vblendvps_avx(auVar115,auVar138,auVar307);
  fVar146 = auVar307._0_4_;
  if ((fVar165 != fVar146) || (NAN(fVar165) || NAN(fVar146))) {
    if ((fVar143 != fVar144) || (NAN(fVar143) || NAN(fVar144))) {
      auVar87._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
      auVar87._8_4_ = auVar76._8_4_ ^ 0x80000000;
      auVar87._12_4_ = auVar76._12_4_ ^ 0x80000000;
      auVar160._0_4_ = -fVar144 / (fVar143 - fVar144);
      auVar160._4_12_ = auVar87._4_12_;
      auVar307 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar160._0_4_)),auVar160,ZEXT416(0));
      auVar73 = auVar307;
    }
    else {
      auVar307 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar144 != 0.0) || (auVar73 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar144))) {
        auVar307 = SUB6416(ZEXT464(0xff800000),0);
        auVar73 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar298 = vminss_avx(auVar298,auVar73);
    auVar291 = vmaxss_avx(auVar307,auVar291);
  }
  if ((fVar220 != fVar146) || (NAN(fVar220) || NAN(fVar146))) {
    auVar298 = vminss_avx(auVar298,SUB6416(ZEXT464(0x3f800000),0));
    auVar291 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar291);
  }
  auVar307 = vmaxss_avx(ZEXT816(0) << 0x40,auVar298);
  auVar298 = vminss_avx(auVar291,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar298._0_4_ < auVar307._0_4_) goto LAB_01294626;
  auVar307 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar307._0_4_ + -0.1)));
  auVar298 = vminss_avx(ZEXT416((uint)(auVar298._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar176._0_8_ = auVar75._0_8_;
  auVar176._8_8_ = auVar176._0_8_;
  auVar264._8_8_ = auVar228._0_8_;
  auVar264._0_8_ = auVar228._0_8_;
  auVar279._8_8_ = auVar79._0_8_;
  auVar279._0_8_ = auVar79._0_8_;
  auVar73 = vshufpd_avx(auVar228,auVar228,3);
  auVar74 = vshufpd_avx(auVar79,auVar79,3);
  auVar291 = vshufps_avx(auVar307,auVar298,0);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = 0x3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar75 = vsubps_avx(auVar88,auVar291);
  local_458._0_4_ = auVar308._0_4_;
  local_458._4_4_ = auVar308._4_4_;
  fStack_450 = auVar308._8_4_;
  fStack_44c = auVar308._12_4_;
  fVar146 = auVar291._0_4_;
  auVar89._0_4_ = fVar146 * (float)local_458._0_4_;
  fVar144 = auVar291._4_4_;
  auVar89._4_4_ = fVar144 * (float)local_458._4_4_;
  fVar143 = auVar291._8_4_;
  auVar89._8_4_ = fVar143 * fStack_450;
  fVar164 = auVar291._12_4_;
  auVar89._12_4_ = fVar164 * fStack_44c;
  auVar215._0_4_ = fVar146 * auVar73._0_4_;
  auVar215._4_4_ = fVar144 * auVar73._4_4_;
  auVar215._8_4_ = fVar143 * auVar73._8_4_;
  auVar215._12_4_ = fVar164 * auVar73._12_4_;
  auVar230._0_4_ = fVar146 * auVar74._0_4_;
  auVar230._4_4_ = fVar144 * auVar74._4_4_;
  auVar230._8_4_ = fVar143 * auVar74._8_4_;
  auVar230._12_4_ = fVar164 * auVar74._12_4_;
  local_528 = auVar19._0_4_;
  fStack_524 = auVar19._4_4_;
  fStack_520 = auVar19._8_4_;
  fStack_51c = auVar19._12_4_;
  auVar254._0_4_ = fVar146 * local_528;
  auVar254._4_4_ = fVar144 * fStack_524;
  auVar254._8_4_ = fVar143 * fStack_520;
  auVar254._12_4_ = fVar164 * fStack_51c;
  auVar73 = vfmadd231ps_fma(auVar89,auVar75,auVar176);
  auVar74 = vfmadd231ps_fma(auVar215,auVar75,auVar264);
  auVar291 = vfmadd231ps_fma(auVar230,auVar75,auVar279);
  auVar75 = vfmadd231ps_fma(auVar254,auVar75,ZEXT816(0));
  auVar308 = vmovshdup_avx(auVar82);
  auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar308._0_4_ * auVar307._0_4_)),auVar82,
                            ZEXT416((uint)(1.0 - auVar307._0_4_)));
  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar308._0_4_ * auVar298._0_4_)),auVar82,
                            ZEXT416((uint)(1.0 - auVar298._0_4_)));
  fVar146 = 1.0 / fVar100;
  auVar307 = vsubps_avx(auVar74,auVar73);
  auVar265._0_4_ = auVar307._0_4_ * 3.0;
  auVar265._4_4_ = auVar307._4_4_ * 3.0;
  auVar265._8_4_ = auVar307._8_4_ * 3.0;
  auVar265._12_4_ = auVar307._12_4_ * 3.0;
  auVar307 = vsubps_avx(auVar291,auVar74);
  auVar280._0_4_ = auVar307._0_4_ * 3.0;
  auVar280._4_4_ = auVar307._4_4_ * 3.0;
  auVar280._8_4_ = auVar307._8_4_ * 3.0;
  auVar280._12_4_ = auVar307._12_4_ * 3.0;
  auVar307 = vsubps_avx(auVar75,auVar291);
  auVar292._0_4_ = auVar307._0_4_ * 3.0;
  auVar292._4_4_ = auVar307._4_4_ * 3.0;
  auVar292._8_4_ = auVar307._8_4_ * 3.0;
  auVar292._12_4_ = auVar307._12_4_ * 3.0;
  auVar308 = vminps_avx(auVar280,auVar292);
  auVar307 = vmaxps_avx(auVar280,auVar292);
  auVar308 = vminps_avx(auVar265,auVar308);
  auVar307 = vmaxps_avx(auVar265,auVar307);
  auVar82 = vshufpd_avx(auVar308,auVar308,3);
  auVar19 = vshufpd_avx(auVar307,auVar307,3);
  auVar308 = vminps_avx(auVar308,auVar82);
  auVar307 = vmaxps_avx(auVar307,auVar19);
  auVar281._0_4_ = auVar308._0_4_ * fVar146;
  auVar281._4_4_ = auVar308._4_4_ * fVar146;
  auVar281._8_4_ = auVar308._8_4_ * fVar146;
  auVar281._12_4_ = auVar308._12_4_ * fVar146;
  auVar266._0_4_ = auVar307._0_4_ * fVar146;
  auVar266._4_4_ = auVar307._4_4_ * fVar146;
  auVar266._8_4_ = auVar307._8_4_ * fVar146;
  auVar266._12_4_ = auVar307._12_4_ * fVar146;
  fVar146 = 1.0 / (auVar79._0_4_ - auVar78._0_4_);
  auVar307 = vshufpd_avx(auVar73,auVar73,3);
  auVar308 = vshufpd_avx(auVar74,auVar74,3);
  auVar82 = vshufpd_avx(auVar291,auVar291,3);
  auVar19 = vshufpd_avx(auVar75,auVar75,3);
  auVar307 = vsubps_avx(auVar307,auVar73);
  auVar298 = vsubps_avx(auVar308,auVar74);
  auVar73 = vsubps_avx(auVar82,auVar291);
  auVar19 = vsubps_avx(auVar19,auVar75);
  auVar308 = vminps_avx(auVar307,auVar298);
  auVar307 = vmaxps_avx(auVar307,auVar298);
  auVar82 = vminps_avx(auVar73,auVar19);
  auVar82 = vminps_avx(auVar308,auVar82);
  auVar308 = vmaxps_avx(auVar73,auVar19);
  auVar307 = vmaxps_avx(auVar307,auVar308);
  auVar313._0_4_ = fVar146 * auVar82._0_4_;
  auVar313._4_4_ = fVar146 * auVar82._4_4_;
  auVar313._8_4_ = fVar146 * auVar82._8_4_;
  auVar313._12_4_ = fVar146 * auVar82._12_4_;
  auVar299._0_4_ = fVar146 * auVar307._0_4_;
  auVar299._4_4_ = fVar146 * auVar307._4_4_;
  auVar299._8_4_ = fVar146 * auVar307._8_4_;
  auVar299._12_4_ = fVar146 * auVar307._12_4_;
  auVar19 = vinsertps_avx(auVar122,auVar78,0x10);
  auVar298 = vinsertps_avx(auVar306,auVar79,0x10);
  auVar293._0_4_ = (auVar19._0_4_ + auVar298._0_4_) * 0.5;
  auVar293._4_4_ = (auVar19._4_4_ + auVar298._4_4_) * 0.5;
  auVar293._8_4_ = (auVar19._8_4_ + auVar298._8_4_) * 0.5;
  auVar293._12_4_ = (auVar19._12_4_ + auVar298._12_4_) * 0.5;
  auVar90._4_4_ = auVar293._0_4_;
  auVar90._0_4_ = auVar293._0_4_;
  auVar90._8_4_ = auVar293._0_4_;
  auVar90._12_4_ = auVar293._0_4_;
  auVar307 = vfmadd213ps_fma(auVar20,auVar90,auVar16);
  auVar308 = vfmadd213ps_fma(auVar21,auVar90,auVar22);
  auVar82 = vfmadd213ps_fma(auVar102,auVar90,auVar187);
  auVar306 = vsubps_avx(auVar308,auVar307);
  auVar307 = vfmadd213ps_fma(auVar306,auVar90,auVar307);
  auVar306 = vsubps_avx(auVar82,auVar308);
  auVar306 = vfmadd213ps_fma(auVar306,auVar90,auVar308);
  auVar306 = vsubps_avx(auVar306,auVar307);
  auVar307 = vfmadd231ps_fma(auVar307,auVar306,auVar90);
  auVar91._0_8_ = CONCAT44(auVar306._4_4_ * 3.0,auVar306._0_4_ * 3.0);
  auVar91._8_4_ = auVar306._8_4_ * 3.0;
  auVar91._12_4_ = auVar306._12_4_ * 3.0;
  auVar325._8_8_ = auVar307._0_8_;
  auVar325._0_8_ = auVar307._0_8_;
  auVar306 = vshufpd_avx(auVar307,auVar307,3);
  auVar307 = vshufps_avx(auVar293,auVar293,0x55);
  auVar74 = vsubps_avx(auVar306,auVar325);
  auVar75 = vfmadd231ps_fma(auVar325,auVar307,auVar74);
  auVar333._8_8_ = auVar91._0_8_;
  auVar333._0_8_ = auVar91._0_8_;
  auVar306 = vshufpd_avx(auVar91,auVar91,3);
  auVar306 = vsubps_avx(auVar306,auVar333);
  auVar291 = vfmadd213ps_fma(auVar306,auVar307,auVar333);
  auVar307 = vmovshdup_avx(auVar291);
  auVar334._0_8_ = auVar307._0_8_ ^ 0x8000000080000000;
  auVar334._8_4_ = auVar307._8_4_ ^ 0x80000000;
  auVar334._12_4_ = auVar307._12_4_ ^ 0x80000000;
  auVar308 = vmovshdup_avx(auVar74);
  auVar306 = vunpcklps_avx(auVar308,auVar334);
  auVar82 = vshufps_avx(auVar306,auVar334,4);
  auVar73 = vshufps_avx(auVar293,auVar293,0x54);
  auVar161._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
  auVar161._8_4_ = auVar74._8_4_ ^ 0x80000000;
  auVar161._12_4_ = auVar74._12_4_ ^ 0x80000000;
  auVar306 = vmovlhps_avx(auVar161,auVar291);
  auVar306 = vshufps_avx(auVar306,auVar291,8);
  auVar307 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar307._0_4_)),auVar308,auVar291);
  uVar68 = auVar307._0_4_;
  auVar92._4_4_ = uVar68;
  auVar92._0_4_ = uVar68;
  auVar92._8_4_ = uVar68;
  auVar92._12_4_ = uVar68;
  auVar307 = vdivps_avx(auVar82,auVar92);
  auVar308 = vdivps_avx(auVar306,auVar92);
  fVar143 = auVar75._0_4_;
  fVar146 = auVar307._0_4_;
  auVar306 = vshufps_avx(auVar75,auVar75,0x55);
  fVar144 = auVar308._0_4_;
  auVar93._0_4_ = fVar143 * fVar146 + auVar306._0_4_ * fVar144;
  auVar93._4_4_ = fVar143 * auVar307._4_4_ + auVar306._4_4_ * auVar308._4_4_;
  auVar93._8_4_ = fVar143 * auVar307._8_4_ + auVar306._8_4_ * auVar308._8_4_;
  auVar93._12_4_ = fVar143 * auVar307._12_4_ + auVar306._12_4_ * auVar308._12_4_;
  auVar77 = vsubps_avx(auVar73,auVar93);
  auVar73 = vmovshdup_avx(auVar307);
  auVar306 = vinsertps_avx(auVar281,auVar313,0x1c);
  auVar191._0_4_ = auVar73._0_4_ * auVar306._0_4_;
  auVar191._4_4_ = auVar73._4_4_ * auVar306._4_4_;
  auVar191._8_4_ = auVar73._8_4_ * auVar306._8_4_;
  auVar191._12_4_ = auVar73._12_4_ * auVar306._12_4_;
  auVar82 = vinsertps_avx(auVar266,auVar299,0x1c);
  auVar116._0_4_ = auVar82._0_4_ * auVar73._0_4_;
  auVar116._4_4_ = auVar82._4_4_ * auVar73._4_4_;
  auVar116._8_4_ = auVar82._8_4_ * auVar73._8_4_;
  auVar116._12_4_ = auVar82._12_4_ * auVar73._12_4_;
  auVar75 = vminps_avx(auVar191,auVar116);
  auVar291 = vmaxps_avx(auVar116,auVar191);
  auVar73 = vinsertps_avx(auVar313,auVar281,0x4c);
  auVar76 = vmovshdup_avx(auVar308);
  auVar74 = vinsertps_avx(auVar299,auVar266,0x4c);
  auVar300._0_4_ = auVar76._0_4_ * auVar73._0_4_;
  auVar300._4_4_ = auVar76._4_4_ * auVar73._4_4_;
  auVar300._8_4_ = auVar76._8_4_ * auVar73._8_4_;
  auVar300._12_4_ = auVar76._12_4_ * auVar73._12_4_;
  auVar282._0_4_ = auVar76._0_4_ * auVar74._0_4_;
  auVar282._4_4_ = auVar76._4_4_ * auVar74._4_4_;
  auVar282._8_4_ = auVar76._8_4_ * auVar74._8_4_;
  auVar282._12_4_ = auVar76._12_4_ * auVar74._12_4_;
  auVar76 = vminps_avx(auVar300,auVar282);
  auVar314._0_4_ = auVar75._0_4_ + auVar76._0_4_;
  auVar314._4_4_ = auVar75._4_4_ + auVar76._4_4_;
  auVar314._8_4_ = auVar75._8_4_ + auVar76._8_4_;
  auVar314._12_4_ = auVar75._12_4_ + auVar76._12_4_;
  auVar75 = vmaxps_avx(auVar282,auVar300);
  auVar117._0_4_ = auVar75._0_4_ + auVar291._0_4_;
  auVar117._4_4_ = auVar75._4_4_ + auVar291._4_4_;
  auVar117._8_4_ = auVar75._8_4_ + auVar291._8_4_;
  auVar117._12_4_ = auVar75._12_4_ + auVar291._12_4_;
  auVar283._8_8_ = 0x3f80000000000000;
  auVar283._0_8_ = 0x3f80000000000000;
  auVar291 = vsubps_avx(auVar283,auVar117);
  auVar75 = vsubps_avx(auVar283,auVar314);
  auVar76 = vsubps_avx(auVar19,auVar293);
  auVar157 = vsubps_avx(auVar298,auVar293);
  auVar139._0_4_ = fVar146 * auVar306._0_4_;
  auVar139._4_4_ = fVar146 * auVar306._4_4_;
  auVar139._8_4_ = fVar146 * auVar306._8_4_;
  auVar139._12_4_ = fVar146 * auVar306._12_4_;
  auVar315._0_4_ = fVar146 * auVar82._0_4_;
  auVar315._4_4_ = fVar146 * auVar82._4_4_;
  auVar315._8_4_ = fVar146 * auVar82._8_4_;
  auVar315._12_4_ = fVar146 * auVar82._12_4_;
  auVar82 = vminps_avx(auVar139,auVar315);
  auVar306 = vmaxps_avx(auVar315,auVar139);
  auVar192._0_4_ = fVar144 * auVar73._0_4_;
  auVar192._4_4_ = fVar144 * auVar73._4_4_;
  auVar192._8_4_ = fVar144 * auVar73._8_4_;
  auVar192._12_4_ = fVar144 * auVar73._12_4_;
  auVar267._0_4_ = fVar144 * auVar74._0_4_;
  auVar267._4_4_ = fVar144 * auVar74._4_4_;
  auVar267._8_4_ = fVar144 * auVar74._8_4_;
  auVar267._12_4_ = fVar144 * auVar74._12_4_;
  auVar73 = vminps_avx(auVar192,auVar267);
  auVar316._0_4_ = auVar82._0_4_ + auVar73._0_4_;
  auVar316._4_4_ = auVar82._4_4_ + auVar73._4_4_;
  auVar316._8_4_ = auVar82._8_4_ + auVar73._8_4_;
  auVar316._12_4_ = auVar82._12_4_ + auVar73._12_4_;
  fVar220 = auVar76._0_4_;
  auVar326._0_4_ = fVar220 * auVar291._0_4_;
  fVar237 = auVar76._4_4_;
  auVar326._4_4_ = fVar237 * auVar291._4_4_;
  fVar238 = auVar76._8_4_;
  auVar326._8_4_ = fVar238 * auVar291._8_4_;
  fVar239 = auVar76._12_4_;
  auVar326._12_4_ = fVar239 * auVar291._12_4_;
  auVar82 = vmaxps_avx(auVar267,auVar192);
  auVar268._0_4_ = fVar220 * auVar75._0_4_;
  auVar268._4_4_ = fVar237 * auVar75._4_4_;
  auVar268._8_4_ = fVar238 * auVar75._8_4_;
  auVar268._12_4_ = fVar239 * auVar75._12_4_;
  fVar143 = auVar157._0_4_;
  auVar118._0_4_ = fVar143 * auVar291._0_4_;
  fVar164 = auVar157._4_4_;
  auVar118._4_4_ = fVar164 * auVar291._4_4_;
  fVar165 = auVar157._8_4_;
  auVar118._8_4_ = fVar165 * auVar291._8_4_;
  fVar166 = auVar157._12_4_;
  auVar118._12_4_ = fVar166 * auVar291._12_4_;
  auVar284._0_4_ = fVar143 * auVar75._0_4_;
  auVar284._4_4_ = fVar164 * auVar75._4_4_;
  auVar284._8_4_ = fVar165 * auVar75._8_4_;
  auVar284._12_4_ = fVar166 * auVar75._12_4_;
  auVar140._0_4_ = auVar306._0_4_ + auVar82._0_4_;
  auVar140._4_4_ = auVar306._4_4_ + auVar82._4_4_;
  auVar140._8_4_ = auVar306._8_4_ + auVar82._8_4_;
  auVar140._12_4_ = auVar306._12_4_ + auVar82._12_4_;
  auVar193._8_8_ = 0x3f800000;
  auVar193._0_8_ = 0x3f800000;
  auVar306 = vsubps_avx(auVar193,auVar140);
  auVar82 = vsubps_avx(auVar193,auVar316);
  auVar317._0_4_ = fVar220 * auVar306._0_4_;
  auVar317._4_4_ = fVar237 * auVar306._4_4_;
  auVar317._8_4_ = fVar238 * auVar306._8_4_;
  auVar317._12_4_ = fVar239 * auVar306._12_4_;
  auVar301._0_4_ = fVar220 * auVar82._0_4_;
  auVar301._4_4_ = fVar237 * auVar82._4_4_;
  auVar301._8_4_ = fVar238 * auVar82._8_4_;
  auVar301._12_4_ = fVar239 * auVar82._12_4_;
  auVar141._0_4_ = fVar143 * auVar306._0_4_;
  auVar141._4_4_ = fVar164 * auVar306._4_4_;
  auVar141._8_4_ = fVar165 * auVar306._8_4_;
  auVar141._12_4_ = fVar166 * auVar306._12_4_;
  auVar194._0_4_ = fVar143 * auVar82._0_4_;
  auVar194._4_4_ = fVar164 * auVar82._4_4_;
  auVar194._8_4_ = fVar165 * auVar82._8_4_;
  auVar194._12_4_ = fVar166 * auVar82._12_4_;
  auVar306 = vminps_avx(auVar317,auVar301);
  auVar82 = vminps_avx(auVar141,auVar194);
  auVar306 = vminps_avx(auVar306,auVar82);
  auVar82 = vmaxps_avx(auVar301,auVar317);
  auVar73 = vmaxps_avx(auVar194,auVar141);
  auVar74 = vminps_avx(auVar326,auVar268);
  auVar291 = vminps_avx(auVar118,auVar284);
  auVar74 = vminps_avx(auVar74,auVar291);
  auVar306 = vhaddps_avx(auVar306,auVar74);
  auVar82 = vmaxps_avx(auVar73,auVar82);
  auVar73 = vmaxps_avx(auVar268,auVar326);
  auVar74 = vmaxps_avx(auVar284,auVar118);
  auVar73 = vmaxps_avx(auVar74,auVar73);
  auVar82 = vhaddps_avx(auVar82,auVar73);
  auVar306 = vshufps_avx(auVar306,auVar306,0xe8);
  auVar82 = vshufps_avx(auVar82,auVar82,0xe8);
  auVar285._0_4_ = auVar77._0_4_ + auVar306._0_4_;
  auVar285._4_4_ = auVar77._4_4_ + auVar306._4_4_;
  auVar285._8_4_ = auVar77._8_4_ + auVar306._8_4_;
  auVar285._12_4_ = auVar77._12_4_ + auVar306._12_4_;
  auVar269._0_4_ = auVar77._0_4_ + auVar82._0_4_;
  auVar269._4_4_ = auVar77._4_4_ + auVar82._4_4_;
  auVar269._8_4_ = auVar77._8_4_ + auVar82._8_4_;
  auVar269._12_4_ = auVar77._12_4_ + auVar82._12_4_;
  auVar306 = vmaxps_avx(auVar19,auVar285);
  auVar82 = vminps_avx(auVar269,auVar298);
  auVar306 = vcmpps_avx(auVar82,auVar306,1);
  auVar306 = vshufps_avx(auVar306,auVar306,0x50);
  if ((auVar306 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar306[0xf] < '\0')
  goto LAB_01294626;
  bVar61 = 0;
  if ((auVar235._0_4_ < auVar285._0_4_) && (bVar61 = 0, auVar269._0_4_ < auVar298._0_4_)) {
    auVar82 = vmovshdup_avx(auVar285);
    auVar306 = vcmpps_avx(auVar269,auVar298,1);
    bVar61 = auVar306[4] & auVar78._0_4_ < auVar82._0_4_;
  }
  p03.field_0.i[0] = auVar23._0_4_;
  p03.field_0.i[1] = auVar23._4_4_;
  p03.field_0.i[2] = auVar23._8_4_;
  p03.field_0.i[3] = auVar23._12_4_;
  if (((3 < (uint)uVar60 || fVar100 < 0.001) | bVar61) == 1) {
    lVar63 = 0xc9;
    do {
      lVar63 = lVar63 + -1;
      if (lVar63 == 0) goto LAB_01294626;
      fVar164 = auVar77._0_4_;
      fVar143 = 1.0 - fVar164;
      fVar100 = fVar143 * fVar143 * fVar143;
      fVar145 = fVar164 * 3.0 * fVar143 * fVar143;
      fVar143 = fVar143 * fVar164 * fVar164 * 3.0;
      auVar177._4_4_ = fVar100;
      auVar177._0_4_ = fVar100;
      auVar177._8_4_ = fVar100;
      auVar177._12_4_ = fVar100;
      auVar142._4_4_ = fVar145;
      auVar142._0_4_ = fVar145;
      auVar142._8_4_ = fVar145;
      auVar142._12_4_ = fVar145;
      auVar119._4_4_ = fVar143;
      auVar119._0_4_ = fVar143;
      auVar119._8_4_ = fVar143;
      auVar119._12_4_ = fVar143;
      fVar164 = fVar164 * fVar164 * fVar164;
      auVar195._0_4_ = p03.field_0.v[0] * fVar164;
      auVar195._4_4_ = p03.field_0.v[1] * fVar164;
      auVar195._8_4_ = p03.field_0.v[2] * fVar164;
      auVar195._12_4_ = p03.field_0.v[3] * fVar164;
      auVar122 = vfmadd231ps_fma(auVar195,auVar187,auVar119);
      auVar122 = vfmadd231ps_fma(auVar122,auVar22,auVar142);
      auVar122 = vfmadd231ps_fma(auVar122,auVar16,auVar177);
      auVar120._8_8_ = auVar122._0_8_;
      auVar120._0_8_ = auVar122._0_8_;
      auVar122 = vshufpd_avx(auVar122,auVar122,3);
      auVar306 = vshufps_avx(auVar77,auVar77,0x55);
      auVar122 = vsubps_avx(auVar122,auVar120);
      auVar306 = vfmadd213ps_fma(auVar122,auVar306,auVar120);
      fVar100 = auVar306._0_4_;
      auVar122 = vshufps_avx(auVar306,auVar306,0x55);
      auVar121._0_4_ = fVar146 * fVar100 + fVar144 * auVar122._0_4_;
      auVar121._4_4_ = auVar307._4_4_ * fVar100 + auVar308._4_4_ * auVar122._4_4_;
      auVar121._8_4_ = auVar307._8_4_ * fVar100 + auVar308._8_4_ * auVar122._8_4_;
      auVar121._12_4_ = auVar307._12_4_ * fVar100 + auVar308._12_4_ * auVar122._12_4_;
      auVar77 = vsubps_avx(auVar77,auVar121);
      auVar122 = vandps_avx(auVar70,auVar306);
      auVar306 = vshufps_avx(auVar122,auVar122,0xf5);
      auVar122 = vmaxss_avx(auVar306,auVar122);
    } while (fVar128 <= auVar122._0_4_);
    local_218 = auVar77._0_4_;
    if ((0.0 <= local_218) && (local_218 <= 1.0)) {
      auVar122 = vmovshdup_avx(auVar77);
      fVar100 = auVar122._0_4_;
      if ((0.0 <= fVar100) && (fVar100 <= 1.0)) {
        auVar122 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                 ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar73 = vinsertps_avx(auVar122,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar122 = vdpps_avx(auVar73,auVar24,0x7f);
        auVar306 = vdpps_avx(auVar73,auVar109,0x7f);
        auVar307 = vdpps_avx(auVar73,auVar17,0x7f);
        auVar308 = vdpps_avx(auVar73,auVar133,0x7f);
        auVar82 = vdpps_avx(auVar73,auVar150,0x7f);
        auVar19 = vdpps_avx(auVar73,auVar69,0x7f);
        auVar298 = vdpps_avx(auVar73,auVar71,0x7f);
        auVar73 = vdpps_avx(auVar73,auVar72,0x7f);
        fVar145 = 1.0 - fVar100;
        auVar122 = vfmadd231ss_fma(ZEXT416((uint)(fVar100 * auVar82._0_4_)),ZEXT416((uint)fVar145),
                                   auVar122);
        auVar306 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ * fVar100)),ZEXT416((uint)fVar145),
                                   auVar306);
        auVar307 = vfmadd231ss_fma(ZEXT416((uint)(auVar298._0_4_ * fVar100)),ZEXT416((uint)fVar145),
                                   auVar307);
        auVar308 = vfmadd231ss_fma(ZEXT416((uint)(fVar100 * auVar73._0_4_)),ZEXT416((uint)fVar145),
                                   auVar308);
        fVar143 = 1.0 - local_218;
        fVar145 = fVar143 * local_218 * local_218 * 3.0;
        fVar165 = local_218 * local_218 * local_218;
        auVar307 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * auVar308._0_4_)),ZEXT416((uint)fVar145),
                                   auVar307);
        fVar146 = local_218 * 3.0 * fVar143 * fVar143;
        auVar306 = vfmadd231ss_fma(auVar307,ZEXT416((uint)fVar146),auVar306);
        fVar144 = fVar143 * fVar143 * fVar143;
        auVar122 = vfmadd231ss_fma(auVar306,ZEXT416((uint)fVar144),auVar122);
        fVar164 = auVar122._0_4_;
        if (((fVar67 <= fVar164) && (fVar166 = *(float *)(ray + k * 4 + 0x80), fVar164 <= fVar166))
           && (pGVar9 = (context->scene->geometries).items[uVar59].ptr,
              (pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
          auVar122 = vshufps_avx(auVar77,auVar77,0x55);
          auVar270._8_4_ = 0x3f800000;
          auVar270._0_8_ = 0x3f8000003f800000;
          auVar270._12_4_ = 0x3f800000;
          auVar306 = vsubps_avx(auVar270,auVar122);
          local_408 = auVar181._0_4_;
          fStack_404 = auVar181._4_4_;
          fStack_400 = auVar181._8_4_;
          fStack_3fc = auVar181._12_4_;
          fVar220 = auVar122._0_4_;
          auVar286._0_4_ = fVar220 * local_408;
          fVar237 = auVar122._4_4_;
          auVar286._4_4_ = fVar237 * fStack_404;
          fVar238 = auVar122._8_4_;
          auVar286._8_4_ = fVar238 * fStack_400;
          fVar239 = auVar122._12_4_;
          auVar286._12_4_ = fVar239 * fStack_3fc;
          local_4c8 = auVar221._0_4_;
          fStack_4c4 = auVar221._4_4_;
          fStack_4c0 = auVar221._8_4_;
          fStack_4bc = auVar221._12_4_;
          auVar294._0_4_ = fVar220 * local_4c8;
          auVar294._4_4_ = fVar237 * fStack_4c4;
          auVar294._8_4_ = fVar238 * fStack_4c0;
          auVar294._12_4_ = fVar239 * fStack_4bc;
          local_4d8 = auVar244._0_4_;
          fStack_4d4 = auVar244._4_4_;
          fStack_4d0 = auVar244._8_4_;
          fStack_4cc = auVar244._12_4_;
          auVar302._0_4_ = fVar220 * local_4d8;
          auVar302._4_4_ = fVar237 * fStack_4d4;
          auVar302._8_4_ = fVar238 * fStack_4d0;
          auVar302._12_4_ = fVar239 * fStack_4cc;
          local_4e8 = auVar245._0_4_;
          fStack_4e4 = auVar245._4_4_;
          fStack_4e0 = auVar245._8_4_;
          fStack_4dc = auVar245._12_4_;
          auVar318._0_4_ = fVar220 * local_4e8;
          auVar318._4_4_ = fVar237 * fStack_4e4;
          auVar318._8_4_ = fVar238 * fStack_4e0;
          auVar318._12_4_ = fVar239 * fStack_4dc;
          auVar307 = vfmadd231ps_fma(auVar286,auVar306,auVar130);
          auVar308 = vfmadd231ps_fma(auVar294,auVar306,auVar131);
          auVar82 = vfmadd231ps_fma(auVar302,auVar306,auVar147);
          auVar19 = vfmadd231ps_fma(auVar318,auVar306,auVar167);
          auVar306 = vsubps_avx(auVar308,auVar307);
          auVar307 = vsubps_avx(auVar82,auVar308);
          auVar308 = vsubps_avx(auVar19,auVar82);
          auVar319._0_4_ = local_218 * auVar307._0_4_;
          auVar319._4_4_ = local_218 * auVar307._4_4_;
          auVar319._8_4_ = local_218 * auVar307._8_4_;
          auVar319._12_4_ = local_218 * auVar307._12_4_;
          auVar255._4_4_ = fVar143;
          auVar255._0_4_ = fVar143;
          auVar255._8_4_ = fVar143;
          auVar255._12_4_ = fVar143;
          auVar306 = vfmadd231ps_fma(auVar319,auVar255,auVar306);
          auVar287._0_4_ = local_218 * auVar308._0_4_;
          auVar287._4_4_ = local_218 * auVar308._4_4_;
          auVar287._8_4_ = local_218 * auVar308._8_4_;
          auVar287._12_4_ = local_218 * auVar308._12_4_;
          auVar307 = vfmadd231ps_fma(auVar287,auVar255,auVar307);
          auVar288._0_4_ = local_218 * auVar307._0_4_;
          auVar288._4_4_ = local_218 * auVar307._4_4_;
          auVar288._8_4_ = local_218 * auVar307._8_4_;
          auVar288._12_4_ = local_218 * auVar307._12_4_;
          auVar307 = vfmadd231ps_fma(auVar288,auVar255,auVar306);
          local_368 = auVar199._0_4_;
          fStack_364 = auVar199._4_4_;
          fStack_360 = auVar199._8_4_;
          fStack_35c = auVar199._12_4_;
          auVar231._0_4_ = fVar165 * local_368;
          auVar231._4_4_ = fVar165 * fStack_364;
          auVar231._8_4_ = fVar165 * fStack_360;
          auVar231._12_4_ = fVar165 * fStack_35c;
          auVar178._4_4_ = fVar145;
          auVar178._0_4_ = fVar145;
          auVar178._8_4_ = fVar145;
          auVar178._12_4_ = fVar145;
          auVar306 = vfmadd132ps_fma(auVar178,auVar231,auVar132);
          auVar216._4_4_ = fVar146;
          auVar216._0_4_ = fVar146;
          auVar216._8_4_ = fVar146;
          auVar216._12_4_ = fVar146;
          auVar306 = vfmadd132ps_fma(auVar216,auVar306,auVar129);
          auVar232._0_4_ = auVar307._0_4_ * 3.0;
          auVar232._4_4_ = auVar307._4_4_ * 3.0;
          auVar232._8_4_ = auVar307._8_4_ * 3.0;
          auVar232._12_4_ = auVar307._12_4_ * 3.0;
          auVar196._4_4_ = fVar144;
          auVar196._0_4_ = fVar144;
          auVar196._8_4_ = fVar144;
          auVar196._12_4_ = fVar144;
          auVar307 = vfmadd132ps_fma(auVar196,auVar306,auVar103);
          auVar306 = vshufps_avx(auVar232,auVar232,0xc9);
          auVar179._0_4_ = auVar307._0_4_ * auVar306._0_4_;
          auVar179._4_4_ = auVar307._4_4_ * auVar306._4_4_;
          auVar179._8_4_ = auVar307._8_4_ * auVar306._8_4_;
          auVar179._12_4_ = auVar307._12_4_ * auVar306._12_4_;
          auVar306 = vshufps_avx(auVar307,auVar307,0xc9);
          auVar306 = vfmsub231ps_fma(auVar179,auVar232,auVar306);
          local_228 = auVar306._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = fVar164;
            uVar68 = vextractps_avx(auVar306,1);
            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar68;
            uVar68 = vextractps_avx(auVar306,2);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar68;
            *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
            *(float *)(ray + k * 4 + 0xf0) = local_218;
            *(float *)(ray + k * 4 + 0x100) = fVar100;
            *(uint *)(ray + k * 4 + 0x110) = uVar8;
            *(uint *)(ray + k * 4 + 0x120) = uVar59;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
          else {
            auVar307 = vshufps_avx(auVar306,auVar306,0x55);
            auVar306 = vshufps_avx(auVar306,auVar306,0xaa);
            local_248[0] = (RTCHitN)auVar307[0];
            local_248[1] = (RTCHitN)auVar307[1];
            local_248[2] = (RTCHitN)auVar307[2];
            local_248[3] = (RTCHitN)auVar307[3];
            local_248[4] = (RTCHitN)auVar307[4];
            local_248[5] = (RTCHitN)auVar307[5];
            local_248[6] = (RTCHitN)auVar307[6];
            local_248[7] = (RTCHitN)auVar307[7];
            local_248[8] = (RTCHitN)auVar307[8];
            local_248[9] = (RTCHitN)auVar307[9];
            local_248[10] = (RTCHitN)auVar307[10];
            local_248[0xb] = (RTCHitN)auVar307[0xb];
            local_248[0xc] = (RTCHitN)auVar307[0xc];
            local_248[0xd] = (RTCHitN)auVar307[0xd];
            local_248[0xe] = (RTCHitN)auVar307[0xe];
            local_248[0xf] = (RTCHitN)auVar307[0xf];
            local_238 = auVar306;
            uStack_224 = local_228;
            uStack_220 = local_228;
            uStack_21c = local_228;
            fStack_214 = local_218;
            fStack_210 = local_218;
            fStack_20c = local_218;
            local_208 = auVar122;
            local_1f8 = CONCAT44(uVar8,uVar8);
            uStack_1f0 = CONCAT44(uVar8,uVar8);
            local_1e8._4_4_ = uVar59;
            local_1e8._0_4_ = uVar59;
            local_1e8._8_4_ = uVar59;
            local_1e8._12_4_ = uVar59;
            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
            uStack_1d4 = context->user->instID[0];
            local_1d8 = uStack_1d4;
            uStack_1d0 = uStack_1d4;
            uStack_1cc = uStack_1d4;
            uStack_1c8 = context->user->instPrimID[0];
            uStack_1c4 = uStack_1c8;
            uStack_1c0 = uStack_1c8;
            uStack_1bc = uStack_1c8;
            *(float *)(ray + k * 4 + 0x80) = fVar164;
            local_478 = *local_468;
            args.valid = (int *)local_478;
            args.geometryUserPtr = pGVar9->userPtr;
            args.context = context->user;
            args.hit = local_248;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar9->intersectionFilterN)(&args);
              auVar127._8_56_ = extraout_var;
              auVar127._0_8_ = extraout_XMM1_Qa;
              auVar306 = auVar127._0_16_;
            }
            if (local_478 == (undefined1  [16])0x0) {
              auVar122 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar306 = vpcmpeqd_avx(auVar306,auVar306);
              auVar122 = auVar122 ^ auVar306;
            }
            else {
              p_Var15 = context->args->filter;
              auVar306 = vpcmpeqd_avx(auVar122,auVar122);
              if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var15)(&args);
                auVar306 = vpcmpeqd_avx(auVar306,auVar306);
              }
              auVar307 = vpcmpeqd_avx(local_478,_DAT_01f45a50);
              auVar122 = auVar307 ^ auVar306;
              if (local_478 != (undefined1  [16])0x0) {
                auVar307 = auVar307 ^ auVar306;
                auVar306 = vmaskmovps_avx(auVar307,*(undefined1 (*) [16])args.hit);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar306;
                auVar306 = vmaskmovps_avx(auVar307,*(undefined1 (*) [16])(args.hit + 0x10));
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar306;
                auVar306 = vmaskmovps_avx(auVar307,*(undefined1 (*) [16])(args.hit + 0x20));
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar306;
                auVar306 = vmaskmovps_avx(auVar307,*(undefined1 (*) [16])(args.hit + 0x30));
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar306;
                auVar306 = vmaskmovps_avx(auVar307,*(undefined1 (*) [16])(args.hit + 0x40));
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar306;
                auVar306 = vmaskmovps_avx(auVar307,*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar306;
                auVar306 = vmaskmovps_avx(auVar307,*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar306;
                auVar306 = vmaskmovps_avx(auVar307,*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar306;
                auVar306 = vmaskmovps_avx(auVar307,*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar306;
              }
            }
            auVar94._8_8_ = 0x100000001;
            auVar94._0_8_ = 0x100000001;
            if ((auVar94 & auVar122) == (undefined1  [16])0x0) {
              *(float *)(ray + k * 4 + 0x80) = fVar166;
            }
          }
        }
      }
    }
    goto LAB_01294626;
  }
  auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)fVar145),0x10);
  auVar82 = vinsertps_avx(auVar78,ZEXT416((uint)auVar79._0_4_),0x10);
  goto LAB_01294075;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }